

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  long lVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  byte bVar63;
  ulong uVar64;
  long lVar65;
  byte bVar66;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  bool bVar67;
  byte bVar68;
  uint uVar69;
  undefined1 uVar70;
  bool bVar71;
  undefined1 uVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar127;
  uint uVar128;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar129;
  uint uVar133;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar82 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float pp;
  float fVar134;
  undefined4 uVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar148;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar149;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar159 [32];
  undefined1 auVar150 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar216 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined4 uVar231;
  undefined4 uVar232;
  undefined4 uVar233;
  undefined4 uVar234;
  undefined4 uVar235;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a18;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_980 [16];
  uint local_96c;
  float local_968;
  float local_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  ulong local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar74 = (ulong)(byte)PVar1;
  fVar199 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar85 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar82 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar198 = fVar199 * auVar82._0_4_;
  fVar134 = fVar199 * auVar85._0_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar78);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar84);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar76);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar98 = vpmovsxbd_avx2(auVar79);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vcvtdq2ps_avx(auVar98);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar74 + 6);
  auVar90 = vpmovsxbd_avx2(auVar80);
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar64 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 + 6);
  auVar95 = vpmovsxbd_avx2(auVar81);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 + uVar74 + 6);
  auVar96 = vpmovsxbd_avx2(auVar77);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar73 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar88 = vpmovsxbd_avx2(auVar249);
  auVar97 = vcvtdq2ps_avx(auVar88);
  auVar108._4_4_ = fVar134;
  auVar108._0_4_ = fVar134;
  auVar108._8_4_ = fVar134;
  auVar108._12_4_ = fVar134;
  auVar108._16_4_ = fVar134;
  auVar108._20_4_ = fVar134;
  auVar108._24_4_ = fVar134;
  auVar108._28_4_ = fVar134;
  auVar209._8_4_ = 1;
  auVar209._0_8_ = 0x100000001;
  auVar209._12_4_ = 1;
  auVar209._16_4_ = 1;
  auVar209._20_4_ = 1;
  auVar209._24_4_ = 1;
  auVar209._28_4_ = 1;
  auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = ZEXT1632(CONCAT412(fVar199 * auVar85._12_4_,
                                CONCAT48(fVar199 * auVar85._8_4_,
                                         CONCAT44(fVar199 * auVar85._4_4_,fVar134))));
  auVar99 = vpermps_avx2(auVar209,auVar100);
  auVar87 = vpermps_avx512vl(auVar86,auVar100);
  fVar134 = auVar87._0_4_;
  fVar163 = auVar87._4_4_;
  auVar100._4_4_ = fVar163 * auVar92._4_4_;
  auVar100._0_4_ = fVar134 * auVar92._0_4_;
  fVar165 = auVar87._8_4_;
  auVar100._8_4_ = fVar165 * auVar92._8_4_;
  fVar167 = auVar87._12_4_;
  auVar100._12_4_ = fVar167 * auVar92._12_4_;
  fVar148 = auVar87._16_4_;
  auVar100._16_4_ = fVar148 * auVar92._16_4_;
  fVar169 = auVar87._20_4_;
  auVar100._20_4_ = fVar169 * auVar92._20_4_;
  fVar171 = auVar87._24_4_;
  auVar100._24_4_ = fVar171 * auVar92._24_4_;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar90._4_4_ * fVar163;
  auVar98._0_4_ = auVar90._0_4_ * fVar134;
  auVar98._8_4_ = auVar90._8_4_ * fVar165;
  auVar98._12_4_ = auVar90._12_4_ * fVar167;
  auVar98._16_4_ = auVar90._16_4_ * fVar148;
  auVar98._20_4_ = auVar90._20_4_ * fVar169;
  auVar98._24_4_ = auVar90._24_4_ * fVar171;
  auVar98._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar97._4_4_ * fVar163;
  auVar88._0_4_ = auVar97._0_4_ * fVar134;
  auVar88._8_4_ = auVar97._8_4_ * fVar165;
  auVar88._12_4_ = auVar97._12_4_ * fVar167;
  auVar88._16_4_ = auVar97._16_4_ * fVar148;
  auVar88._20_4_ = auVar97._20_4_ * fVar169;
  auVar88._24_4_ = auVar97._24_4_ * fVar171;
  auVar88._28_4_ = auVar87._28_4_;
  auVar78 = vfmadd231ps_fma(auVar100,auVar99,auVar89);
  auVar84 = vfmadd231ps_fma(auVar98,auVar99,auVar94);
  auVar76 = vfmadd231ps_fma(auVar88,auVar96,auVar99);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar108,auVar91);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar108,auVar93);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar95,auVar108);
  auVar109._4_4_ = fVar198;
  auVar109._0_4_ = fVar198;
  auVar109._8_4_ = fVar198;
  auVar109._12_4_ = fVar198;
  auVar109._16_4_ = fVar198;
  auVar109._20_4_ = fVar198;
  auVar109._24_4_ = fVar198;
  auVar109._28_4_ = fVar198;
  auVar88 = ZEXT1632(CONCAT412(fVar199 * auVar82._12_4_,
                               CONCAT48(fVar199 * auVar82._8_4_,
                                        CONCAT44(fVar199 * auVar82._4_4_,fVar198))));
  auVar98 = vpermps_avx2(auVar209,auVar88);
  auVar88 = vpermps_avx512vl(auVar86,auVar88);
  fVar199 = auVar88._0_4_;
  fVar134 = auVar88._4_4_;
  auVar99._4_4_ = fVar134 * auVar92._4_4_;
  auVar99._0_4_ = fVar199 * auVar92._0_4_;
  fVar163 = auVar88._8_4_;
  auVar99._8_4_ = fVar163 * auVar92._8_4_;
  fVar165 = auVar88._12_4_;
  auVar99._12_4_ = fVar165 * auVar92._12_4_;
  fVar167 = auVar88._16_4_;
  auVar99._16_4_ = fVar167 * auVar92._16_4_;
  fVar148 = auVar88._20_4_;
  auVar99._20_4_ = fVar148 * auVar92._20_4_;
  fVar169 = auVar88._24_4_;
  auVar99._24_4_ = fVar169 * auVar92._24_4_;
  auVar99._28_4_ = 1;
  auVar86._4_4_ = auVar90._4_4_ * fVar134;
  auVar86._0_4_ = auVar90._0_4_ * fVar199;
  auVar86._8_4_ = auVar90._8_4_ * fVar163;
  auVar86._12_4_ = auVar90._12_4_ * fVar165;
  auVar86._16_4_ = auVar90._16_4_ * fVar167;
  auVar86._20_4_ = auVar90._20_4_ * fVar148;
  auVar86._24_4_ = auVar90._24_4_ * fVar169;
  auVar86._28_4_ = auVar92._28_4_;
  auVar90._4_4_ = auVar97._4_4_ * fVar134;
  auVar90._0_4_ = auVar97._0_4_ * fVar199;
  auVar90._8_4_ = auVar97._8_4_ * fVar163;
  auVar90._12_4_ = auVar97._12_4_ * fVar165;
  auVar90._16_4_ = auVar97._16_4_ * fVar167;
  auVar90._20_4_ = auVar97._20_4_ * fVar148;
  auVar90._24_4_ = auVar97._24_4_ * fVar169;
  auVar90._28_4_ = auVar88._28_4_;
  auVar83 = vfmadd231ps_fma(auVar99,auVar98,auVar89);
  auVar79 = vfmadd231ps_fma(auVar86,auVar98,auVar94);
  auVar80 = vfmadd231ps_fma(auVar90,auVar98,auVar96);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar109,auVar91);
  auVar240 = ZEXT1664(auVar83);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar109,auVar93);
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar109,auVar95);
  auVar91 = vandps_avx(ZEXT1632(auVar78),auVar105);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar91,auVar107,1);
  bVar67 = (bool)((byte)uVar64 & 1);
  auVar87._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar78._0_4_;
  bVar67 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar78._4_4_;
  bVar67 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar78._8_4_;
  bVar67 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar78._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar84),auVar105);
  uVar64 = vcmpps_avx512vl(auVar91,auVar107,1);
  bVar67 = (bool)((byte)uVar64 & 1);
  auVar101._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar84._0_4_;
  bVar67 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar84._4_4_;
  bVar67 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar84._8_4_;
  bVar67 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar84._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar76),auVar105);
  uVar64 = vcmpps_avx512vl(auVar91,auVar107,1);
  bVar67 = (bool)((byte)uVar64 & 1);
  auVar91._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._0_4_;
  bVar67 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._4_4_;
  bVar67 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._8_4_;
  bVar67 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar106._8_4_ = 0x3f800000;
  auVar106._0_8_ = 0x3f8000003f800000;
  auVar106._12_4_ = 0x3f800000;
  auVar106._16_4_ = 0x3f800000;
  auVar106._20_4_ = 0x3f800000;
  auVar106._24_4_ = 0x3f800000;
  auVar106._28_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar87,auVar89,auVar106);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar101);
  auVar84 = vfnmadd213ps_fma(auVar101,auVar89,auVar106);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar91);
  auVar76 = vfnmadd213ps_fma(auVar91,auVar89,auVar106);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar89,auVar89);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar83));
  auVar95._4_4_ = auVar78._4_4_ * auVar91._4_4_;
  auVar95._0_4_ = auVar78._0_4_ * auVar91._0_4_;
  auVar95._8_4_ = auVar78._8_4_ * auVar91._8_4_;
  auVar95._12_4_ = auVar78._12_4_ * auVar91._12_4_;
  auVar95._16_4_ = auVar91._16_4_ * 0.0;
  auVar95._20_4_ = auVar91._20_4_ * 0.0;
  auVar95._24_4_ = auVar91._24_4_ * 0.0;
  auVar95._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar83));
  auVar90 = vpbroadcastd_avx512vl();
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar104._0_4_ = auVar78._0_4_ * auVar91._0_4_;
  auVar104._4_4_ = auVar78._4_4_ * auVar91._4_4_;
  auVar104._8_4_ = auVar78._8_4_ * auVar91._8_4_;
  auVar104._12_4_ = auVar78._12_4_ * auVar91._12_4_;
  auVar104._16_4_ = auVar91._16_4_ * 0.0;
  auVar104._20_4_ = auVar91._20_4_ * 0.0;
  auVar104._24_4_ = auVar91._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar74 * -2 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar79));
  auVar96._4_4_ = auVar84._4_4_ * auVar91._4_4_;
  auVar96._0_4_ = auVar84._0_4_ * auVar91._0_4_;
  auVar96._8_4_ = auVar84._8_4_ * auVar91._8_4_;
  auVar96._12_4_ = auVar84._12_4_ * auVar91._12_4_;
  auVar96._16_4_ = auVar91._16_4_ * 0.0;
  auVar96._20_4_ = auVar91._20_4_ * 0.0;
  auVar96._24_4_ = auVar91._24_4_ * 0.0;
  auVar96._28_4_ = auVar91._28_4_;
  auVar91 = vcvtdq2ps_avx(auVar89);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar79));
  auVar103._0_4_ = auVar84._0_4_ * auVar91._0_4_;
  auVar103._4_4_ = auVar84._4_4_ * auVar91._4_4_;
  auVar103._8_4_ = auVar84._8_4_ * auVar91._8_4_;
  auVar103._12_4_ = auVar84._12_4_ * auVar91._12_4_;
  auVar103._16_4_ = auVar91._16_4_ * 0.0;
  auVar103._20_4_ = auVar91._20_4_ * 0.0;
  auVar103._24_4_ = auVar91._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar74 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar80));
  auVar97._4_4_ = auVar91._4_4_ * auVar76._4_4_;
  auVar97._0_4_ = auVar91._0_4_ * auVar76._0_4_;
  auVar97._8_4_ = auVar91._8_4_ * auVar76._8_4_;
  auVar97._12_4_ = auVar91._12_4_ * auVar76._12_4_;
  auVar97._16_4_ = auVar91._16_4_ * 0.0;
  auVar97._20_4_ = auVar91._20_4_ * 0.0;
  auVar97._24_4_ = auVar91._24_4_ * 0.0;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar80));
  auVar102._0_4_ = auVar76._0_4_ * auVar91._0_4_;
  auVar102._4_4_ = auVar76._4_4_ * auVar91._4_4_;
  auVar102._8_4_ = auVar76._8_4_ * auVar91._8_4_;
  auVar102._12_4_ = auVar76._12_4_ * auVar91._12_4_;
  auVar102._16_4_ = auVar91._16_4_ * 0.0;
  auVar102._20_4_ = auVar91._20_4_ * 0.0;
  auVar102._24_4_ = auVar91._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar95,auVar104);
  auVar89 = vpminsd_avx2(auVar96,auVar103);
  auVar91 = vmaxps_avx(auVar91,auVar89);
  auVar89 = vpminsd_avx2(auVar97,auVar102);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar92._4_4_ = uVar135;
  auVar92._0_4_ = uVar135;
  auVar92._8_4_ = uVar135;
  auVar92._12_4_ = uVar135;
  auVar92._16_4_ = uVar135;
  auVar92._20_4_ = uVar135;
  auVar92._24_4_ = uVar135;
  auVar92._28_4_ = uVar135;
  auVar89 = vmaxps_avx512vl(auVar89,auVar92);
  auVar91 = vmaxps_avx(auVar91,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_2a0 = vmulps_avx512vl(auVar91,auVar89);
  auVar91 = vpmaxsd_avx2(auVar95,auVar104);
  auVar89 = vpmaxsd_avx2(auVar96,auVar103);
  auVar91 = vminps_avx(auVar91,auVar89);
  auVar89 = vpmaxsd_avx2(auVar97,auVar102);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar135;
  auVar93._0_4_ = uVar135;
  auVar93._8_4_ = uVar135;
  auVar93._12_4_ = uVar135;
  auVar93._16_4_ = uVar135;
  auVar93._20_4_ = uVar135;
  auVar93._24_4_ = uVar135;
  auVar93._28_4_ = uVar135;
  auVar89 = vminps_avx512vl(auVar89,auVar93);
  auVar91 = vminps_avx(auVar91,auVar89);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar94);
  uVar14 = vpcmpgtd_avx512vl(auVar90,_DAT_01fe9900);
  uVar12 = vcmpps_avx512vl(local_2a0,auVar91,2);
  if ((byte)((byte)uVar12 & (byte)uVar14) == 0) {
    return false;
  }
  local_5e8 = (ulong)(byte)((byte)uVar12 & (byte)uVar14);
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f0 = prim;
LAB_01cdc738:
  lVar65 = 0;
  for (uVar64 = local_5e8; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar65 = lVar65 + 1;
  }
  local_718 = (ulong)*(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[local_718].ptr;
  lVar3 = *(long *)&pGVar2[1].time_range.upper;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           (ulong)*(uint *)(prim + lVar65 * 4 + 6) *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar78 = *(undefined1 (*) [16])(lVar3 + (long)pGVar2[1].intersectionFilterN * uVar64);
  auVar84 = *(undefined1 (*) [16])(lVar3 + (long)pGVar2[1].intersectionFilterN * (uVar64 + 1));
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar76 = vunpcklps_avx512vl(local_3a0._0_16_,local_3c0._0_16_);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar249 = auVar91._0_16_;
  local_6b0 = vinsertps_avx512f(auVar76,auVar249,0x28);
  auVar82._8_4_ = 0xbeaaaaab;
  auVar82._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar82._12_4_ = 0xbeaaaaab;
  auVar80 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              uVar64 * (long)pGVar2[2].pointQueryFunc),auVar78,auVar82);
  auVar79 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar2[2].intersectionFilterN +
                             (long)pGVar2[2].pointQueryFunc * (uVar64 + 1)),auVar84,auVar82);
  auVar212._0_4_ = auVar84._0_4_ + auVar78._0_4_ + auVar80._0_4_ + auVar79._0_4_;
  auVar212._4_4_ = auVar84._4_4_ + auVar78._4_4_ + auVar80._4_4_ + auVar79._4_4_;
  auVar212._8_4_ = auVar84._8_4_ + auVar78._8_4_ + auVar80._8_4_ + auVar79._8_4_;
  auVar212._12_4_ = auVar84._12_4_ + auVar78._12_4_ + auVar80._12_4_ + auVar79._12_4_;
  auVar85._8_4_ = 0x3e800000;
  auVar85._0_8_ = 0x3e8000003e800000;
  auVar85._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar212,auVar85);
  auVar76 = vsubps_avx(auVar76,auVar83);
  auVar76 = vdpps_avx(auVar76,local_6b0,0x7f);
  fVar199 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  local_470 = vpbroadcastd_avx512vl();
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = local_6c0._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
  auVar81 = vfnmadd213ss_fma(auVar77,local_6c0,ZEXT416(0x40000000));
  local_280 = auVar76._0_4_ * auVar77._0_4_ * auVar81._0_4_;
  auVar220._4_4_ = local_280;
  auVar220._0_4_ = local_280;
  auVar220._8_4_ = local_280;
  auVar220._12_4_ = local_280;
  fStack_950 = local_280;
  _local_960 = auVar220;
  fStack_94c = local_280;
  fStack_948 = local_280;
  fStack_944 = local_280;
  auVar76 = vfmadd231ps_fma(auVar83,local_6b0,auVar220);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar78 = vsubps_avx(auVar78,auVar76);
  auVar83 = vsubps_avx(auVar79,auVar76);
  auVar79 = vsubps_avx(auVar80,auVar76);
  auVar84 = vsubps_avx(auVar84,auVar76);
  uVar135 = auVar78._0_4_;
  local_840._4_4_ = uVar135;
  local_840._0_4_ = uVar135;
  local_840._8_4_ = uVar135;
  local_840._12_4_ = uVar135;
  local_840._16_4_ = uVar135;
  local_840._20_4_ = uVar135;
  local_840._24_4_ = uVar135;
  local_840._28_4_ = uVar135;
  auVar229 = ZEXT3264(local_840);
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  local_560 = ZEXT1632(auVar78);
  local_820 = vpermps_avx2(auVar111,local_560);
  auVar230 = ZEXT3264(local_820);
  auVar114._8_4_ = 2;
  auVar114._0_8_ = 0x200000002;
  auVar114._12_4_ = 2;
  auVar114._16_4_ = 2;
  auVar114._20_4_ = 2;
  auVar114._24_4_ = 2;
  auVar114._28_4_ = 2;
  local_860 = vpermps_avx512vl(auVar114,local_560);
  auVar251 = ZEXT3264(local_860);
  auVar115._8_4_ = 3;
  auVar115._0_8_ = 0x300000003;
  auVar115._12_4_ = 3;
  auVar115._16_4_ = 3;
  auVar115._20_4_ = 3;
  auVar115._24_4_ = 3;
  auVar115._28_4_ = 3;
  local_7a0 = vpermps_avx2(auVar115,local_560);
  auVar238 = ZEXT3264(local_7a0);
  uVar135 = auVar79._0_4_;
  local_260._4_4_ = uVar135;
  local_260._0_4_ = uVar135;
  local_260._8_4_ = uVar135;
  local_260._12_4_ = uVar135;
  local_260._16_4_ = uVar135;
  local_260._20_4_ = uVar135;
  local_260._24_4_ = uVar135;
  local_260._28_4_ = uVar135;
  local_5a0 = ZEXT1632(auVar79);
  local_5e0 = vpermps_avx2(auVar111,local_5a0);
  local_880 = vpermps_avx512vl(auVar114,local_5a0);
  auVar252 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar115,local_5a0);
  auVar241 = ZEXT3264(local_8a0);
  local_8c0 = vbroadcastss_avx512vl(auVar83);
  auVar242 = ZEXT3264(local_8c0);
  local_580 = ZEXT1632(auVar83);
  local_8e0 = vpermps_avx512vl(auVar111,local_580);
  auVar243 = ZEXT3264(local_8e0);
  local_7c0 = vpermps_avx512vl(auVar114,local_580);
  auVar244 = ZEXT3264(local_7c0);
  local_900 = vpermps_avx512vl(auVar115,local_580);
  auVar245 = ZEXT3264(local_900);
  auVar211 = ZEXT3264(local_5e0);
  local_7e0 = vbroadcastss_avx512vl(auVar84);
  auVar246 = ZEXT3264(local_7e0);
  _local_5c0 = ZEXT1632(auVar84);
  local_920 = vpermps_avx512vl(auVar111,_local_5c0);
  auVar247 = ZEXT3264(local_920);
  local_800 = vpermps_avx512vl(auVar114,_local_5c0);
  auVar248 = ZEXT3264(local_800);
  local_940 = vpermps_avx512vl(auVar115,_local_5c0);
  auVar250 = ZEXT3264(local_940);
  auVar78 = vmulss_avx512f(auVar249,auVar249);
  auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),local_3c0,local_3c0);
  local_240 = vfmadd231ps_avx512vl(auVar89,local_3a0,local_3a0);
  uVar135 = local_240._0_4_;
  local_220._4_4_ = uVar135;
  local_220._0_4_ = uVar135;
  local_220._8_4_ = uVar135;
  local_220._12_4_ = uVar135;
  local_220._16_4_ = uVar135;
  local_220._20_4_ = uVar135;
  local_220._24_4_ = uVar135;
  local_220._28_4_ = uVar135;
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar110);
  local_640 = ZEXT416((uint)local_280);
  local_280 = fVar199 - local_280;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  uVar64 = 0;
  bVar67 = false;
  local_a18 = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar78 = vsqrtss_avx(local_6c0,local_6c0);
  local_964 = auVar78._0_4_;
  auVar78 = vsqrtss_avx(local_6c0,local_6c0);
  local_968 = auVar78._0_4_;
  local_650 = ZEXT816(0x3f80000000000000);
  auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar78 = vmovshdup_avx(local_650);
    auVar78 = vsubps_avx(auVar78,local_650);
    fVar134 = auVar78._0_4_;
    fVar148 = fVar134 * 0.04761905;
    auVar202._0_4_ = local_650._0_4_;
    auVar202._4_4_ = auVar202._0_4_;
    auVar202._8_4_ = auVar202._0_4_;
    auVar202._12_4_ = auVar202._0_4_;
    auVar202._16_4_ = auVar202._0_4_;
    auVar202._20_4_ = auVar202._0_4_;
    auVar202._24_4_ = auVar202._0_4_;
    auVar202._28_4_ = auVar202._0_4_;
    local_780._4_4_ = fVar134;
    local_780._0_4_ = fVar134;
    local_780._8_4_ = fVar134;
    local_780._12_4_ = fVar134;
    local_780._16_4_ = fVar134;
    local_780._20_4_ = fVar134;
    local_780._24_4_ = fVar134;
    local_780._28_4_ = fVar134;
    auVar78 = vfmadd231ps_fma(auVar202,local_780,_DAT_01faff20);
    auVar110 = auVar218._0_32_;
    auVar89 = vsubps_avx(auVar110,ZEXT1632(auVar78));
    fVar134 = auVar78._0_4_;
    fVar163 = auVar78._4_4_;
    auVar60._4_4_ = local_260._4_4_ * fVar163;
    auVar60._0_4_ = local_260._0_4_ * fVar134;
    fVar165 = auVar78._8_4_;
    auVar60._8_4_ = local_260._8_4_ * fVar165;
    fVar167 = auVar78._12_4_;
    auVar60._12_4_ = local_260._12_4_ * fVar167;
    auVar60._16_4_ = local_260._16_4_ * 0.0;
    auVar60._20_4_ = local_260._20_4_ * 0.0;
    auVar60._24_4_ = local_260._24_4_ * 0.0;
    auVar60._28_4_ = DAT_01faff20._28_4_;
    auVar94 = ZEXT1632(auVar78);
    auVar39._4_4_ = auVar211._4_4_ * fVar163;
    auVar39._0_4_ = auVar211._0_4_ * fVar134;
    auVar39._8_4_ = auVar211._8_4_ * fVar165;
    auVar39._12_4_ = auVar211._12_4_ * fVar167;
    auVar39._16_4_ = auVar211._16_4_ * 0.0;
    auVar39._20_4_ = auVar211._20_4_ * 0.0;
    auVar39._24_4_ = auVar211._24_4_ * 0.0;
    auVar39._28_4_ = auVar202._0_4_;
    auVar92 = vmulps_avx512vl(auVar252._0_32_,auVar94);
    auVar93 = vmulps_avx512vl(auVar241._0_32_,auVar94);
    auVar84 = vfmadd231ps_fma(auVar60,auVar89,auVar229._0_32_);
    auVar76 = vfmadd231ps_fma(auVar39,auVar89,auVar230._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar251._0_32_);
    auVar83 = vfmadd231ps_fma(auVar93,auVar89,auVar238._0_32_);
    auVar93 = vmulps_avx512vl(auVar242._0_32_,auVar94);
    auVar98 = ZEXT1632(auVar78);
    auVar94 = vmulps_avx512vl(auVar243._0_32_,auVar98);
    auVar90 = vmulps_avx512vl(auVar244._0_32_,auVar98);
    auVar95 = vmulps_avx512vl(auVar245._0_32_,auVar98);
    auVar79 = vfmadd231ps_fma(auVar93,auVar89,local_260);
    auVar80 = vfmadd231ps_fma(auVar94,auVar89,auVar211._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar252._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar89,auVar241._0_32_);
    auVar90 = vmulps_avx512vl(auVar246._0_32_,auVar98);
    auVar95 = vmulps_avx512vl(auVar247._0_32_,auVar98);
    auVar96 = vmulps_avx512vl(auVar248._0_32_,auVar98);
    auVar97 = vmulps_avx512vl(auVar250._0_32_,auVar98);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar242._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,auVar243._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar89,auVar244._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,auVar245._0_32_);
    auVar240._0_28_ =
         ZEXT1628(CONCAT412(fVar167 * auVar79._12_4_,
                            CONCAT48(fVar165 * auVar79._8_4_,
                                     CONCAT44(fVar163 * auVar79._4_4_,fVar134 * auVar79._0_4_))));
    auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar80));
    auVar88 = vmulps_avx512vl(ZEXT1632(auVar78),auVar93);
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar78),auVar94);
    auVar78 = vfmadd231ps_fma(auVar240._0_32_,auVar89,ZEXT1632(auVar84));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,ZEXT1632(auVar76));
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar89,auVar92);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,ZEXT1632(auVar83));
    auVar224._0_4_ = auVar90._0_4_ * fVar134;
    auVar224._4_4_ = auVar90._4_4_ * fVar163;
    auVar224._8_4_ = auVar90._8_4_ * fVar165;
    auVar224._12_4_ = auVar90._12_4_ * fVar167;
    auVar224._16_4_ = auVar90._16_4_ * 0.0;
    auVar224._20_4_ = auVar90._20_4_ * 0.0;
    auVar224._24_4_ = auVar90._24_4_ * 0.0;
    auVar224._28_4_ = 0;
    auVar40._4_4_ = auVar95._4_4_ * fVar163;
    auVar40._0_4_ = auVar95._0_4_ * fVar134;
    auVar40._8_4_ = auVar95._8_4_ * fVar165;
    auVar40._12_4_ = auVar95._12_4_ * fVar167;
    auVar40._16_4_ = auVar95._16_4_ * 0.0;
    auVar40._20_4_ = auVar95._20_4_ * 0.0;
    auVar40._24_4_ = auVar95._24_4_ * 0.0;
    auVar40._28_4_ = auVar90._28_4_;
    auVar41._4_4_ = auVar96._4_4_ * fVar163;
    auVar41._0_4_ = auVar96._0_4_ * fVar134;
    auVar41._8_4_ = auVar96._8_4_ * fVar165;
    auVar41._12_4_ = auVar96._12_4_ * fVar167;
    auVar41._16_4_ = auVar96._16_4_ * 0.0;
    auVar41._20_4_ = auVar96._20_4_ * 0.0;
    auVar41._24_4_ = auVar96._24_4_ * 0.0;
    auVar41._28_4_ = auVar95._28_4_;
    auVar42._4_4_ = auVar97._4_4_ * fVar163;
    auVar42._0_4_ = auVar97._0_4_ * fVar134;
    auVar42._8_4_ = auVar97._8_4_ * fVar165;
    auVar42._12_4_ = auVar97._12_4_ * fVar167;
    auVar42._16_4_ = auVar97._16_4_ * 0.0;
    auVar42._20_4_ = auVar97._20_4_ * 0.0;
    auVar42._24_4_ = auVar97._24_4_ * 0.0;
    auVar42._28_4_ = auVar96._28_4_;
    auVar84 = vfmadd231ps_fma(auVar224,auVar89,ZEXT1632(auVar79));
    auVar76 = vfmadd231ps_fma(auVar40,auVar89,ZEXT1632(auVar80));
    auVar83 = vfmadd231ps_fma(auVar41,auVar89,auVar93);
    auVar79 = vfmadd231ps_fma(auVar42,auVar89,auVar94);
    auVar43._28_4_ = auVar92._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar167 * auVar84._12_4_,
                            CONCAT48(fVar165 * auVar84._8_4_,
                                     CONCAT44(fVar163 * auVar84._4_4_,fVar134 * auVar84._0_4_))));
    auVar80 = vfmadd231ps_fma(auVar43,auVar89,ZEXT1632(auVar78));
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar76._12_4_ * fVar167,
                                            CONCAT48(auVar76._8_4_ * fVar165,
                                                     CONCAT44(auVar76._4_4_ * fVar163,
                                                              auVar76._0_4_ * fVar134)))),auVar89,
                         auVar98);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar83._12_4_ * fVar167,
                                            CONCAT48(auVar83._8_4_ * fVar165,
                                                     CONCAT44(auVar83._4_4_ * fVar163,
                                                              auVar83._0_4_ * fVar134)))),auVar89,
                         auVar88);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar167,
                                            CONCAT48(auVar79._8_4_ * fVar165,
                                                     CONCAT44(auVar79._4_4_ * fVar163,
                                                              auVar79._0_4_ * fVar134)))),auVar99,
                         auVar89);
    auVar89 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar78));
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar76),auVar98);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar83),auVar88);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar79),auVar99);
    auVar236._0_4_ = fVar148 * auVar89._0_4_ * 3.0;
    auVar236._4_4_ = fVar148 * auVar89._4_4_ * 3.0;
    auVar236._8_4_ = fVar148 * auVar89._8_4_ * 3.0;
    auVar236._12_4_ = fVar148 * auVar89._12_4_ * 3.0;
    auVar236._16_4_ = fVar148 * auVar89._16_4_ * 3.0;
    auVar236._20_4_ = fVar148 * auVar89._20_4_ * 3.0;
    auVar236._24_4_ = fVar148 * auVar89._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    auVar237._0_4_ = fVar148 * auVar93._0_4_ * 3.0;
    auVar237._4_4_ = fVar148 * auVar93._4_4_ * 3.0;
    auVar237._8_4_ = fVar148 * auVar93._8_4_ * 3.0;
    auVar237._12_4_ = fVar148 * auVar93._12_4_ * 3.0;
    auVar237._16_4_ = fVar148 * auVar93._16_4_ * 3.0;
    auVar237._20_4_ = fVar148 * auVar93._20_4_ * 3.0;
    auVar237._24_4_ = fVar148 * auVar93._24_4_ * 3.0;
    auVar237._28_4_ = 0;
    auVar44._4_4_ = fVar148 * auVar94._4_4_ * 3.0;
    auVar44._0_4_ = fVar148 * auVar94._0_4_ * 3.0;
    auVar44._8_4_ = fVar148 * auVar94._8_4_ * 3.0;
    auVar44._12_4_ = fVar148 * auVar94._12_4_ * 3.0;
    auVar44._16_4_ = fVar148 * auVar94._16_4_ * 3.0;
    auVar44._20_4_ = fVar148 * auVar94._20_4_ * 3.0;
    auVar44._24_4_ = fVar148 * auVar94._24_4_ * 3.0;
    auVar44._28_4_ = auVar97._28_4_;
    fVar134 = auVar90._0_4_ * 3.0 * fVar148;
    fVar163 = auVar90._4_4_ * 3.0 * fVar148;
    auVar45._4_4_ = fVar163;
    auVar45._0_4_ = fVar134;
    fVar165 = auVar90._8_4_ * 3.0 * fVar148;
    auVar45._8_4_ = fVar165;
    fVar167 = auVar90._12_4_ * 3.0 * fVar148;
    auVar45._12_4_ = fVar167;
    fVar169 = auVar90._16_4_ * 3.0 * fVar148;
    auVar45._16_4_ = fVar169;
    fVar171 = auVar90._20_4_ * 3.0 * fVar148;
    auVar45._20_4_ = fVar171;
    fVar198 = auVar90._24_4_ * 3.0 * fVar148;
    auVar45._24_4_ = fVar198;
    auVar45._28_4_ = fVar148;
    auVar78 = vxorps_avx512vl(auVar252._0_16_,auVar252._0_16_);
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01feed00,ZEXT1632(auVar78));
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar78));
    auVar93 = ZEXT1632(auVar78);
    auVar88 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar93);
    auVar216._0_4_ = auVar92._0_4_ + fVar134;
    auVar216._4_4_ = auVar92._4_4_ + fVar163;
    auVar216._8_4_ = auVar92._8_4_ + fVar165;
    auVar216._12_4_ = auVar92._12_4_ + fVar167;
    auVar216._16_4_ = auVar92._16_4_ + fVar169;
    auVar216._20_4_ = auVar92._20_4_ + fVar171;
    auVar216._24_4_ = auVar92._24_4_ + fVar198;
    auVar216._28_4_ = auVar92._28_4_ + fVar148;
    auVar89 = vmaxps_avx(auVar92,auVar216);
    auVar99 = vminps_avx512vl(auVar92,auVar216);
    auVar100 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar93);
    auVar86 = vpermt2ps_avx512vl(auVar236,_DAT_01feed00,auVar93);
    auVar87 = vpermt2ps_avx512vl(auVar237,_DAT_01feed00,auVar93);
    auVar111 = ZEXT1632(auVar78);
    auVar101 = vpermt2ps_avx512vl(auVar44,_DAT_01feed00,auVar111);
    auVar92 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar111);
    auVar92 = vsubps_avx(auVar100,auVar92);
    auVar93 = vsubps_avx(auVar97,ZEXT1632(auVar80));
    auVar94 = vsubps_avx(auVar98,auVar95);
    auVar90 = vsubps_avx(auVar88,auVar96);
    auVar102 = vmulps_avx512vl(auVar94,auVar44);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar237,auVar90);
    auVar103 = vmulps_avx512vl(auVar90,auVar236);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar44,auVar93);
    auVar104 = vmulps_avx512vl(auVar93,auVar237);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar236,auVar94);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar103 = vmulps_avx512vl(auVar90,auVar90);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar94);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar93,auVar93);
    auVar104 = vrcp14ps_avx512vl(auVar103);
    auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar110);
    auVar104 = vfmadd132ps_avx512vl(auVar105,auVar104,auVar104);
    auVar102 = vmulps_avx512vl(auVar102,auVar104);
    auVar105 = vmulps_avx512vl(auVar94,auVar101);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar87,auVar90);
    auVar106 = vmulps_avx512vl(auVar90,auVar86);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar93);
    auVar107 = vmulps_avx512vl(auVar93,auVar87);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar86,auVar94);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar102 = vmaxps_avx512vl(auVar102,auVar104);
    auVar102 = vsqrtps_avx512vl(auVar102);
    auVar104 = vmaxps_avx512vl(auVar92,auVar100);
    auVar89 = vmaxps_avx512vl(auVar89,auVar104);
    auVar104 = vaddps_avx512vl(auVar102,auVar89);
    auVar89 = vminps_avx(auVar92,auVar100);
    auVar89 = vminps_avx512vl(auVar99,auVar89);
    auVar89 = vsubps_avx512vl(auVar89,auVar102);
    auVar27._8_4_ = 0x3f800002;
    auVar27._0_8_ = 0x3f8000023f800002;
    auVar27._12_4_ = 0x3f800002;
    auVar27._16_4_ = 0x3f800002;
    auVar27._20_4_ = 0x3f800002;
    auVar27._24_4_ = 0x3f800002;
    auVar27._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar104,auVar27);
    auVar28._8_4_ = 0x3f7ffffc;
    auVar28._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar28._12_4_ = 0x3f7ffffc;
    auVar28._16_4_ = 0x3f7ffffc;
    auVar28._20_4_ = 0x3f7ffffc;
    auVar28._24_4_ = 0x3f7ffffc;
    auVar28._28_4_ = 0x3f7ffffc;
    local_740 = vmulps_avx512vl(auVar89,auVar28);
    auVar89 = vmulps_avx512vl(auVar92,auVar92);
    auVar92 = vrsqrt14ps_avx512vl(auVar103);
    auVar29._8_4_ = 0xbf000000;
    auVar29._0_8_ = 0xbf000000bf000000;
    auVar29._12_4_ = 0xbf000000;
    auVar29._16_4_ = 0xbf000000;
    auVar29._20_4_ = 0xbf000000;
    auVar29._24_4_ = 0xbf000000;
    auVar29._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar103,auVar29);
    fVar134 = auVar92._0_4_;
    fVar163 = auVar92._4_4_;
    fVar165 = auVar92._8_4_;
    fVar167 = auVar92._12_4_;
    fVar148 = auVar92._16_4_;
    fVar169 = auVar92._20_4_;
    fVar171 = auVar92._24_4_;
    auVar46._4_4_ = fVar163 * fVar163 * fVar163 * auVar99._4_4_;
    auVar46._0_4_ = fVar134 * fVar134 * fVar134 * auVar99._0_4_;
    auVar46._8_4_ = fVar165 * fVar165 * fVar165 * auVar99._8_4_;
    auVar46._12_4_ = fVar167 * fVar167 * fVar167 * auVar99._12_4_;
    auVar46._16_4_ = fVar148 * fVar148 * fVar148 * auVar99._16_4_;
    auVar46._20_4_ = fVar169 * fVar169 * fVar169 * auVar99._20_4_;
    auVar46._24_4_ = fVar171 * fVar171 * fVar171 * auVar99._24_4_;
    auVar46._28_4_ = auVar104._28_4_;
    auVar30._8_4_ = 0x3fc00000;
    auVar30._0_8_ = 0x3fc000003fc00000;
    auVar30._12_4_ = 0x3fc00000;
    auVar30._16_4_ = 0x3fc00000;
    auVar30._20_4_ = 0x3fc00000;
    auVar30._24_4_ = 0x3fc00000;
    auVar30._28_4_ = 0x3fc00000;
    auVar92 = vfmadd231ps_avx512vl(auVar46,auVar92,auVar30);
    auVar240 = ZEXT3264(auVar92);
    auVar99 = vmulps_avx512vl(auVar93,auVar92);
    auVar100 = vmulps_avx512vl(auVar94,auVar92);
    auVar102 = vmulps_avx512vl(auVar90,auVar92);
    auVar209 = ZEXT1632(auVar80);
    auVar103 = vsubps_avx512vl(auVar111,auVar209);
    auVar104 = vsubps_avx512vl(auVar111,auVar95);
    auVar105 = vsubps_avx512vl(auVar111,auVar96);
    auVar106 = vmulps_avx512vl(auVar91,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_3c0,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_3a0,auVar103);
    auVar107 = vmulps_avx512vl(auVar105,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar103);
    auVar108 = vmulps_avx512vl(auVar91,auVar102);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,local_3c0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar99,local_3a0);
    auVar102 = vmulps_avx512vl(auVar105,auVar102);
    auVar100 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar99);
    auVar100 = vmulps_avx512vl(auVar108,auVar108);
    auVar102 = vsubps_avx512vl(local_220,auVar100);
    auVar109 = vmulps_avx512vl(auVar108,auVar99);
    auVar106 = vsubps_avx512vl(auVar106,auVar109);
    auVar106 = vaddps_avx512vl(auVar106,auVar106);
    auVar109 = vmulps_avx512vl(auVar99,auVar99);
    local_760 = vsubps_avx512vl(auVar107,auVar109);
    auVar89 = vsubps_avx512vl(local_760,auVar89);
    local_680 = vmulps_avx512vl(auVar106,auVar106);
    auVar31._8_4_ = 0x40800000;
    auVar31._0_8_ = 0x4080000040800000;
    auVar31._12_4_ = 0x40800000;
    auVar31._16_4_ = 0x40800000;
    auVar31._20_4_ = 0x40800000;
    auVar31._24_4_ = 0x40800000;
    auVar31._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar102,auVar31);
    auVar107 = vmulps_avx512vl(_local_4c0,auVar89);
    auVar107 = vsubps_avx512vl(local_680,auVar107);
    uVar73 = vcmpps_avx512vl(auVar107,auVar111,5);
    bVar61 = (byte)uVar73;
    fVar134 = (float)local_960._0_4_;
    fVar163 = (float)local_960._4_4_;
    fVar165 = fStack_958;
    fVar167 = fStack_954;
    fVar148 = fStack_950;
    fVar169 = fStack_94c;
    fVar171 = fStack_948;
    fVar198 = fStack_944;
    if (bVar61 == 0) {
      auVar218 = ZEXT3264(auVar110);
LAB_01cdd3b1:
      auVar229 = ZEXT3264(local_840);
      auVar230 = ZEXT3264(local_820);
      auVar251 = ZEXT3264(local_860);
      auVar238 = ZEXT3264(local_7a0);
      auVar211 = ZEXT3264(local_5e0);
      auVar252 = ZEXT3264(local_880);
      auVar241 = ZEXT3264(local_8a0);
      auVar242 = ZEXT3264(local_8c0);
      auVar243 = ZEXT3264(local_8e0);
      auVar244 = ZEXT3264(local_7c0);
      auVar245 = ZEXT3264(local_900);
      auVar246 = ZEXT3264(local_7e0);
      auVar247 = ZEXT3264(local_920);
      auVar248 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(local_940);
    }
    else {
      auVar107 = vsqrtps_avx512vl(auVar107);
      auVar109 = vaddps_avx512vl(auVar102,auVar102);
      local_540 = vrcp14ps_avx512vl(auVar109);
      auVar110 = vfnmadd213ps_avx512vl(local_540,auVar109,auVar110);
      auVar110 = vfmadd132ps_avx512vl(auVar110,local_540,local_540);
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      local_6a0 = vxorps_avx512vl(auVar106,auVar32);
      auVar111 = vsubps_avx512vl(local_6a0,auVar107);
      local_4e0 = vmulps_avx512vl(auVar111,auVar110);
      auVar107 = vsubps_avx512vl(auVar107,auVar106);
      local_6e0 = vmulps_avx512vl(auVar107,auVar110);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar110 = vblendmps_avx512vl(auVar107,local_4e0);
      auVar112._0_4_ =
           (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar107._0_4_;
      bVar71 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar71 * auVar110._4_4_ | (uint)!bVar71 * auVar107._4_4_;
      bVar71 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar71 * auVar110._8_4_ | (uint)!bVar71 * auVar107._8_4_;
      bVar71 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar71 * auVar110._12_4_ | (uint)!bVar71 * auVar107._12_4_;
      bVar71 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar71 * auVar110._16_4_ | (uint)!bVar71 * auVar107._16_4_;
      bVar71 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar71 * auVar110._20_4_ | (uint)!bVar71 * auVar107._20_4_;
      bVar71 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar71 * auVar110._24_4_ | (uint)!bVar71 * auVar107._24_4_;
      bVar71 = SUB81(uVar73 >> 7,0);
      auVar112._28_4_ = (uint)bVar71 * auVar110._28_4_ | (uint)!bVar71 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar107,local_6e0);
      auVar113._0_4_ =
           (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar107._0_4_;
      bVar71 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar71 * auVar110._4_4_ | (uint)!bVar71 * auVar107._4_4_;
      bVar71 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar71 * auVar110._8_4_ | (uint)!bVar71 * auVar107._8_4_;
      bVar71 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar71 * auVar110._12_4_ | (uint)!bVar71 * auVar107._12_4_;
      bVar71 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar71 * auVar110._16_4_ | (uint)!bVar71 * auVar107._16_4_;
      bVar71 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar71 * auVar110._20_4_ | (uint)!bVar71 * auVar107._20_4_;
      bVar71 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar71 * auVar110._24_4_ | (uint)!bVar71 * auVar107._24_4_;
      bVar71 = SUB81(uVar73 >> 7,0);
      auVar113._28_4_ = (uint)bVar71 * auVar110._28_4_ | (uint)!bVar71 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar100,auVar107);
      local_500 = vmaxps_avx512vl(local_240,auVar107);
      auVar33._8_4_ = 0x36000000;
      auVar33._0_8_ = 0x3600000036000000;
      auVar33._12_4_ = 0x36000000;
      auVar33._16_4_ = 0x36000000;
      auVar33._20_4_ = 0x36000000;
      auVar33._24_4_ = 0x36000000;
      auVar33._28_4_ = 0x36000000;
      local_520 = vmulps_avx512vl(local_500,auVar33);
      vandps_avx512vl(auVar102,auVar107);
      uVar74 = vcmpps_avx512vl(local_520,local_520,1);
      uVar73 = uVar73 & uVar74;
      bVar66 = (byte)uVar73;
      if (bVar66 != 0) {
        uVar74 = vcmpps_avx512vl(auVar89,_DAT_01faff00,2);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar102 = vblendmps_avx512vl(auVar89,auVar100);
        bVar68 = (byte)uVar74;
        uVar69 = (uint)(bVar68 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar68 & 1) * local_520._0_4_;
        bVar71 = (bool)((byte)(uVar74 >> 1) & 1);
        uVar75 = (uint)bVar71 * auVar102._4_4_ | (uint)!bVar71 * local_520._4_4_;
        bVar71 = (bool)((byte)(uVar74 >> 2) & 1);
        uVar127 = (uint)bVar71 * auVar102._8_4_ | (uint)!bVar71 * local_520._8_4_;
        bVar71 = (bool)((byte)(uVar74 >> 3) & 1);
        uVar128 = (uint)bVar71 * auVar102._12_4_ | (uint)!bVar71 * local_520._12_4_;
        bVar71 = (bool)((byte)(uVar74 >> 4) & 1);
        uVar129 = (uint)bVar71 * auVar102._16_4_ | (uint)!bVar71 * local_520._16_4_;
        bVar71 = (bool)((byte)(uVar74 >> 5) & 1);
        uVar130 = (uint)bVar71 * auVar102._20_4_ | (uint)!bVar71 * local_520._20_4_;
        bVar71 = (bool)((byte)(uVar74 >> 6) & 1);
        uVar131 = (uint)bVar71 * auVar102._24_4_ | (uint)!bVar71 * local_520._24_4_;
        bVar71 = SUB81(uVar74 >> 7,0);
        uVar132 = (uint)bVar71 * auVar102._28_4_ | (uint)!bVar71 * local_520._28_4_;
        auVar112._0_4_ = (bVar66 & 1) * uVar69 | !(bool)(bVar66 & 1) * auVar112._0_4_;
        bVar71 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = bVar71 * uVar75 | !bVar71 * auVar112._4_4_;
        bVar71 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = bVar71 * uVar127 | !bVar71 * auVar112._8_4_;
        bVar71 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = bVar71 * uVar128 | !bVar71 * auVar112._12_4_;
        bVar71 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar112._16_4_ = bVar71 * uVar129 | !bVar71 * auVar112._16_4_;
        bVar71 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar112._20_4_ = bVar71 * uVar130 | !bVar71 * auVar112._20_4_;
        bVar71 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar112._24_4_ = bVar71 * uVar131 | !bVar71 * auVar112._24_4_;
        bVar71 = SUB81(uVar73 >> 7,0);
        auVar112._28_4_ = bVar71 * uVar132 | !bVar71 * auVar112._28_4_;
        auVar89 = vblendmps_avx512vl(auVar100,auVar89);
        bVar71 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar74 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar74 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar74 >> 6) & 1);
        bVar11 = SUB81(uVar74 >> 7,0);
        auVar113._0_4_ =
             (uint)(bVar66 & 1) *
             ((uint)(bVar68 & 1) * auVar89._0_4_ | !(bool)(bVar68 & 1) * uVar69) |
             !(bool)(bVar66 & 1) * auVar113._0_4_;
        bVar5 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ =
             (uint)bVar5 * ((uint)bVar71 * auVar89._4_4_ | !bVar71 * uVar75) |
             !bVar5 * auVar113._4_4_;
        bVar71 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ =
             (uint)bVar71 * ((uint)bVar6 * auVar89._8_4_ | !bVar6 * uVar127) |
             !bVar71 * auVar113._8_4_;
        bVar71 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ =
             (uint)bVar71 * ((uint)bVar7 * auVar89._12_4_ | !bVar7 * uVar128) |
             !bVar71 * auVar113._12_4_;
        bVar71 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar113._16_4_ =
             (uint)bVar71 * ((uint)bVar8 * auVar89._16_4_ | !bVar8 * uVar129) |
             !bVar71 * auVar113._16_4_;
        bVar71 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar113._20_4_ =
             (uint)bVar71 * ((uint)bVar9 * auVar89._20_4_ | !bVar9 * uVar130) |
             !bVar71 * auVar113._20_4_;
        bVar71 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar113._24_4_ =
             (uint)bVar71 * ((uint)bVar10 * auVar89._24_4_ | !bVar10 * uVar131) |
             !bVar71 * auVar113._24_4_;
        bVar71 = SUB81(uVar73 >> 7,0);
        auVar113._28_4_ =
             (uint)bVar71 * ((uint)bVar11 * auVar89._28_4_ | !bVar11 * uVar132) |
             !bVar71 * auVar113._28_4_;
        bVar61 = (~bVar66 | bVar68) & bVar61;
      }
      if ((bVar61 & 0x7f) == 0) {
        auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01cdd3b1;
      }
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar100 = vxorps_avx512vl(auVar101,auVar89);
      auVar86 = vxorps_avx512vl(auVar86,auVar89);
      uVar69 = *(uint *)(ray + k * 4 + 0x80);
      auVar87 = vxorps_avx512vl(auVar87,auVar89);
      auVar78 = vsubss_avx512f(ZEXT416(uVar69),ZEXT416((uint)local_640._0_4_));
      auVar101 = vbroadcastss_avx512vl(auVar78);
      auVar101 = vminps_avx512vl(auVar101,auVar113);
      auVar59._4_4_ = fStack_27c;
      auVar59._0_4_ = local_280;
      auVar59._8_4_ = fStack_278;
      auVar59._12_4_ = fStack_274;
      auVar59._16_4_ = fStack_270;
      auVar59._20_4_ = fStack_26c;
      auVar59._24_4_ = fStack_268;
      auVar59._28_4_ = fStack_264;
      auVar102 = vmaxps_avx512vl(auVar59,auVar112);
      auVar105 = vmulps_avx512vl(auVar105,auVar44);
      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar237,auVar105);
      auVar78 = vfmadd213ps_fma(auVar103,auVar236,auVar104);
      auVar103 = vmulps_avx512vl(auVar91,auVar44);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar237);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_3a0,auVar236);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar104);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar104,auVar105,1);
      auVar107 = vxorps_avx512vl(ZEXT1632(auVar78),auVar89);
      auVar110 = vrcp14ps_avx512vl(auVar103);
      auVar111 = vxorps_avx512vl(auVar103,auVar89);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar115 = vfnmadd213ps_avx512vl(auVar110,auVar103,auVar114);
      auVar78 = vfmadd132ps_fma(auVar115,auVar110,auVar110);
      fVar149 = auVar78._0_4_ * auVar107._0_4_;
      fVar164 = auVar78._4_4_ * auVar107._4_4_;
      auVar47._4_4_ = fVar164;
      auVar47._0_4_ = fVar149;
      fVar166 = auVar78._8_4_ * auVar107._8_4_;
      auVar47._8_4_ = fVar166;
      fVar168 = auVar78._12_4_ * auVar107._12_4_;
      auVar47._12_4_ = fVar168;
      fVar170 = auVar107._16_4_ * 0.0;
      auVar47._16_4_ = fVar170;
      fVar172 = auVar107._20_4_ * 0.0;
      auVar47._20_4_ = fVar172;
      fVar173 = auVar107._24_4_ * 0.0;
      auVar47._24_4_ = fVar173;
      auVar47._28_4_ = auVar107._28_4_;
      uVar14 = vcmpps_avx512vl(auVar103,auVar111,1);
      bVar66 = (byte)uVar12 | (byte)uVar14;
      auVar227._8_4_ = 0xff800000;
      auVar227._0_8_ = 0xff800000ff800000;
      auVar227._12_4_ = 0xff800000;
      auVar227._16_4_ = 0xff800000;
      auVar227._20_4_ = 0xff800000;
      auVar227._24_4_ = 0xff800000;
      auVar227._28_4_ = 0xff800000;
      auVar115 = vblendmps_avx512vl(auVar47,auVar227);
      auVar116._0_4_ =
           (uint)(bVar66 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar110._0_4_;
      bVar71 = (bool)(bVar66 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar71 * auVar115._4_4_ | (uint)!bVar71 * auVar110._4_4_;
      bVar71 = (bool)(bVar66 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar71 * auVar115._8_4_ | (uint)!bVar71 * auVar110._8_4_;
      bVar71 = (bool)(bVar66 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar71 * auVar115._12_4_ | (uint)!bVar71 * auVar110._12_4_;
      bVar71 = (bool)(bVar66 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar71 * auVar115._16_4_ | (uint)!bVar71 * auVar110._16_4_;
      bVar71 = (bool)(bVar66 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar71 * auVar115._20_4_ | (uint)!bVar71 * auVar110._20_4_;
      bVar71 = (bool)(bVar66 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar71 * auVar115._24_4_ | (uint)!bVar71 * auVar110._24_4_;
      auVar116._28_4_ =
           (uint)(bVar66 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar110._28_4_;
      auVar110 = vmaxps_avx512vl(auVar102,auVar116);
      uVar14 = vcmpps_avx512vl(auVar103,auVar111,6);
      bVar66 = (byte)uVar12 | (byte)uVar14;
      auVar117._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar149;
      bVar71 = (bool)(bVar66 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar164;
      bVar71 = (bool)(bVar66 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar166;
      bVar71 = (bool)(bVar66 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar168;
      bVar71 = (bool)(bVar66 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar170;
      bVar71 = (bool)(bVar66 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar172;
      bVar71 = (bool)(bVar66 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar173;
      auVar117._28_4_ =
           (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar107._28_4_;
      auVar101 = vminps_avx512vl(auVar101,auVar117);
      auVar78 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar78),auVar97);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar78),auVar98);
      auVar102 = ZEXT1632(auVar78);
      auVar88 = vsubps_avx512vl(auVar102,auVar88);
      auVar88 = vmulps_avx512vl(auVar88,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar98);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar86,auVar97);
      auVar98 = vmulps_avx512vl(auVar91,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_3c0,auVar87);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar86);
      vandps_avx512vl(auVar98,auVar104);
      uVar12 = vcmpps_avx512vl(auVar98,auVar105,1);
      auVar97 = vxorps_avx512vl(auVar97,auVar89);
      auVar88 = vrcp14ps_avx512vl(auVar98);
      auVar100 = vxorps_avx512vl(auVar98,auVar89);
      auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar98,auVar114);
      auVar78 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
      fVar149 = auVar78._0_4_ * auVar97._0_4_;
      fVar164 = auVar78._4_4_ * auVar97._4_4_;
      auVar48._4_4_ = fVar164;
      auVar48._0_4_ = fVar149;
      fVar166 = auVar78._8_4_ * auVar97._8_4_;
      auVar48._8_4_ = fVar166;
      fVar168 = auVar78._12_4_ * auVar97._12_4_;
      auVar48._12_4_ = fVar168;
      fVar170 = auVar97._16_4_ * 0.0;
      auVar48._16_4_ = fVar170;
      fVar172 = auVar97._20_4_ * 0.0;
      auVar48._20_4_ = fVar172;
      fVar173 = auVar97._24_4_ * 0.0;
      auVar48._24_4_ = fVar173;
      auVar48._28_4_ = auVar97._28_4_;
      uVar14 = vcmpps_avx512vl(auVar98,auVar100,1);
      bVar66 = (byte)uVar12 | (byte)uVar14;
      auVar89 = vblendmps_avx512vl(auVar48,auVar227);
      auVar118._0_4_ =
           (uint)(bVar66 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar88._0_4_;
      bVar71 = (bool)(bVar66 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar71 * auVar89._4_4_ | (uint)!bVar71 * auVar88._4_4_;
      bVar71 = (bool)(bVar66 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar71 * auVar89._8_4_ | (uint)!bVar71 * auVar88._8_4_;
      bVar71 = (bool)(bVar66 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar71 * auVar89._12_4_ | (uint)!bVar71 * auVar88._12_4_;
      bVar71 = (bool)(bVar66 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar71 * auVar89._16_4_ | (uint)!bVar71 * auVar88._16_4_;
      bVar71 = (bool)(bVar66 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar71 * auVar89._20_4_ | (uint)!bVar71 * auVar88._20_4_;
      bVar71 = (bool)(bVar66 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar71 * auVar89._24_4_ | (uint)!bVar71 * auVar88._24_4_;
      auVar118._28_4_ =
           (uint)(bVar66 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar88._28_4_;
      auVar89 = vmaxps_avx(auVar110,auVar118);
      uVar14 = vcmpps_avx512vl(auVar98,auVar100,6);
      bVar66 = (byte)uVar12 | (byte)uVar14;
      auVar119._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar149;
      bVar71 = (bool)(bVar66 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar164;
      bVar71 = (bool)(bVar66 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar166;
      bVar71 = (bool)(bVar66 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar168;
      bVar71 = (bool)(bVar66 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar170;
      bVar71 = (bool)(bVar66 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar172;
      bVar71 = (bool)(bVar66 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar173;
      auVar119._28_4_ =
           (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar97._28_4_;
      local_300 = vminps_avx(auVar101,auVar119);
      uVar12 = vcmpps_avx512vl(auVar89,local_300,2);
      bVar61 = bVar61 & 0x7f & (byte)uVar12;
      if (bVar61 == 0) {
        auVar218 = ZEXT3264(auVar114);
        goto LAB_01cdd3b1;
      }
      auVar98 = vmaxps_avx512vl(auVar102,local_740);
      auVar97 = vfmadd213ps_avx512vl(local_4e0,auVar108,auVar99);
      fVar149 = auVar92._0_4_;
      fVar164 = auVar92._4_4_;
      auVar49._4_4_ = fVar164 * auVar97._4_4_;
      auVar49._0_4_ = fVar149 * auVar97._0_4_;
      fVar166 = auVar92._8_4_;
      auVar49._8_4_ = fVar166 * auVar97._8_4_;
      fVar168 = auVar92._12_4_;
      auVar49._12_4_ = fVar168 * auVar97._12_4_;
      fVar170 = auVar92._16_4_;
      auVar49._16_4_ = fVar170 * auVar97._16_4_;
      fVar172 = auVar92._20_4_;
      auVar49._20_4_ = fVar172 * auVar97._20_4_;
      fVar173 = auVar92._24_4_;
      auVar49._24_4_ = fVar173 * auVar97._24_4_;
      auVar49._28_4_ = auVar97._28_4_;
      auVar97 = vfmadd213ps_avx512vl(local_6e0,auVar108,auVar99);
      auVar50._4_4_ = fVar164 * auVar97._4_4_;
      auVar50._0_4_ = fVar149 * auVar97._0_4_;
      auVar50._8_4_ = fVar166 * auVar97._8_4_;
      auVar50._12_4_ = fVar168 * auVar97._12_4_;
      auVar50._16_4_ = fVar170 * auVar97._16_4_;
      auVar50._20_4_ = fVar172 * auVar97._20_4_;
      auVar50._24_4_ = fVar173 * auVar97._24_4_;
      auVar50._28_4_ = auVar118._28_4_;
      auVar97 = vminps_avx512vl(auVar49,auVar114);
      auVar56 = ZEXT812(0);
      auVar88 = ZEXT1232(auVar56) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar56) << 0x20);
      auVar100 = vminps_avx512vl(auVar50,auVar114);
      auVar51._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar97._28_4_ + 7.0;
      auVar78 = vfmadd213ps_fma(auVar51,local_780,auVar202);
      local_1e0 = ZEXT1632(auVar78);
      auVar97 = vmaxps_avx(auVar100,ZEXT1232(auVar56) << 0x20);
      auVar52._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar97._28_4_ + 7.0;
      auVar78 = vfmadd213ps_fma(auVar52,local_780,auVar202);
      local_200 = ZEXT1632(auVar78);
      auVar53._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar53._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar53._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar53._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar53._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar53._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar53._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar53._28_4_ = auVar98._28_4_;
      auVar97 = vsubps_avx(local_760,auVar53);
      auVar54._4_4_ = auVar97._4_4_ * (float)local_4c0._4_4_;
      auVar54._0_4_ = auVar97._0_4_ * (float)local_4c0._0_4_;
      auVar54._8_4_ = auVar97._8_4_ * fStack_4b8;
      auVar54._12_4_ = auVar97._12_4_ * fStack_4b4;
      auVar54._16_4_ = auVar97._16_4_ * fStack_4b0;
      auVar54._20_4_ = auVar97._20_4_ * fStack_4ac;
      auVar54._24_4_ = auVar97._24_4_ * fStack_4a8;
      auVar54._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_680,auVar54);
      uVar73 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar56) << 0x20,5);
      auVar248 = ZEXT3264(local_800);
      if ((byte)uVar73 == 0) {
        uVar73 = 0;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar86 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar121._8_4_ = 0xff800000;
        auVar121._0_8_ = 0xff800000ff800000;
        auVar121._12_4_ = 0xff800000;
        auVar121._16_4_ = 0xff800000;
        auVar121._20_4_ = 0xff800000;
        auVar121._24_4_ = 0xff800000;
        auVar121._28_4_ = 0xff800000;
      }
      else {
        uVar74 = vcmpps_avx512vl(auVar98,auVar102,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar88 = vfnmadd213ps_avx512vl(auVar109,local_540,auVar114);
        auVar86 = vfmadd132ps_avx512vl(auVar88,local_540,local_540);
        auVar88 = vsubps_avx(local_6a0,auVar98);
        auVar87 = vmulps_avx512vl(auVar88,auVar86);
        auVar98 = vsubps_avx512vl(auVar98,auVar106);
        auVar101 = vmulps_avx512vl(auVar98,auVar86);
        auVar98 = vfmadd213ps_avx512vl(auVar108,auVar87,auVar99);
        auVar55._4_4_ = fVar164 * auVar98._4_4_;
        auVar55._0_4_ = fVar149 * auVar98._0_4_;
        auVar55._8_4_ = fVar166 * auVar98._8_4_;
        auVar55._12_4_ = fVar168 * auVar98._12_4_;
        auVar55._16_4_ = fVar170 * auVar98._16_4_;
        auVar55._20_4_ = fVar172 * auVar98._20_4_;
        auVar55._24_4_ = fVar173 * auVar98._24_4_;
        auVar55._28_4_ = auVar100._28_4_;
        auVar98 = vmulps_avx512vl(local_3a0,auVar87);
        auVar88 = vmulps_avx512vl(local_3c0,auVar87);
        auVar102 = vmulps_avx512vl(auVar91,auVar87);
        auVar100 = vfmadd213ps_avx512vl(auVar93,auVar55,auVar209);
        auVar100 = vsubps_avx512vl(auVar98,auVar100);
        auVar98 = vfmadd213ps_avx512vl(auVar94,auVar55,auVar95);
        auVar86 = vsubps_avx512vl(auVar88,auVar98);
        auVar78 = vfmadd213ps_fma(auVar55,auVar90,auVar96);
        auVar98 = vsubps_avx(auVar102,ZEXT1632(auVar78));
        auVar88 = vfmadd213ps_avx512vl(auVar108,auVar101,auVar99);
        auVar99 = vmulps_avx512vl(auVar92,auVar88);
        auVar240 = ZEXT3264(auVar99);
        auVar92 = vmulps_avx512vl(local_3a0,auVar101);
        auVar102 = vmulps_avx512vl(local_3c0,auVar101);
        auVar103 = vmulps_avx512vl(auVar91,auVar101);
        auVar78 = vfmadd213ps_fma(auVar93,auVar99,auVar209);
        auVar88 = vsubps_avx(auVar92,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar94,auVar99,auVar95);
        auVar92 = vsubps_avx512vl(auVar102,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar90,auVar99,auVar96);
        auVar93 = vsubps_avx512vl(auVar103,ZEXT1632(auVar78));
        auVar194._8_4_ = 0x7f800000;
        auVar194._0_8_ = 0x7f8000007f800000;
        auVar194._12_4_ = 0x7f800000;
        auVar194._16_4_ = 0x7f800000;
        auVar194._20_4_ = 0x7f800000;
        auVar194._24_4_ = 0x7f800000;
        auVar194._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar194,auVar87);
        bVar71 = (bool)((byte)uVar74 & 1);
        auVar120._0_4_ = (uint)bVar71 * auVar94._0_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar71 * auVar94._4_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar71 * auVar94._8_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar71 * auVar94._12_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar71 * auVar94._16_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar71 * auVar94._20_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar71 * auVar94._24_4_ | (uint)!bVar71 * 0x7f800000;
        bVar71 = SUB81(uVar74 >> 7,0);
        auVar120._28_4_ = (uint)bVar71 * auVar94._28_4_ | (uint)!bVar71 * 0x7f800000;
        auVar210._8_4_ = 0xff800000;
        auVar210._0_8_ = 0xff800000ff800000;
        auVar210._12_4_ = 0xff800000;
        auVar210._16_4_ = 0xff800000;
        auVar210._20_4_ = 0xff800000;
        auVar210._24_4_ = 0xff800000;
        auVar210._28_4_ = 0xff800000;
        auVar94 = vblendmps_avx512vl(auVar210,auVar101);
        bVar71 = (bool)((byte)uVar74 & 1);
        auVar121._0_4_ = (uint)bVar71 * auVar94._0_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar71 * auVar94._4_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar71 * auVar94._8_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar71 * auVar94._12_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar121._16_4_ = (uint)bVar71 * auVar94._16_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar121._20_4_ = (uint)bVar71 * auVar94._20_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar121._24_4_ = (uint)bVar71 * auVar94._24_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = SUB81(uVar74 >> 7,0);
        auVar121._28_4_ = (uint)bVar71 * auVar94._28_4_ | (uint)!bVar71 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar94 = vmulps_avx512vl(local_500,auVar34);
        uVar13 = vcmpps_avx512vl(auVar94,local_520,0xe);
        uVar74 = uVar74 & uVar13;
        bVar66 = (byte)uVar74;
        if (bVar66 != 0) {
          uVar13 = vcmpps_avx512vl(auVar97,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar226._8_4_ = 0x7f800000;
          auVar226._0_8_ = 0x7f8000007f800000;
          auVar226._12_4_ = 0x7f800000;
          auVar226._16_4_ = 0x7f800000;
          auVar226._20_4_ = 0x7f800000;
          auVar226._24_4_ = 0x7f800000;
          auVar226._28_4_ = 0x7f800000;
          auVar228._8_4_ = 0xff800000;
          auVar228._0_8_ = 0xff800000ff800000;
          auVar228._12_4_ = 0xff800000;
          auVar228._16_4_ = 0xff800000;
          auVar228._20_4_ = 0xff800000;
          auVar228._24_4_ = 0xff800000;
          auVar228._28_4_ = 0xff800000;
          auVar90 = vblendmps_avx512vl(auVar226,auVar228);
          bVar68 = (byte)uVar13;
          uVar75 = (uint)(bVar68 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
          bVar71 = (bool)((byte)(uVar13 >> 1) & 1);
          uVar127 = (uint)bVar71 * auVar90._4_4_ | (uint)!bVar71 * auVar94._4_4_;
          bVar71 = (bool)((byte)(uVar13 >> 2) & 1);
          uVar128 = (uint)bVar71 * auVar90._8_4_ | (uint)!bVar71 * auVar94._8_4_;
          bVar71 = (bool)((byte)(uVar13 >> 3) & 1);
          uVar129 = (uint)bVar71 * auVar90._12_4_ | (uint)!bVar71 * auVar94._12_4_;
          bVar71 = (bool)((byte)(uVar13 >> 4) & 1);
          uVar130 = (uint)bVar71 * auVar90._16_4_ | (uint)!bVar71 * auVar94._16_4_;
          bVar71 = (bool)((byte)(uVar13 >> 5) & 1);
          uVar131 = (uint)bVar71 * auVar90._20_4_ | (uint)!bVar71 * auVar94._20_4_;
          bVar71 = (bool)((byte)(uVar13 >> 6) & 1);
          uVar132 = (uint)bVar71 * auVar90._24_4_ | (uint)!bVar71 * auVar94._24_4_;
          bVar71 = SUB81(uVar13 >> 7,0);
          uVar133 = (uint)bVar71 * auVar90._28_4_ | (uint)!bVar71 * auVar94._28_4_;
          auVar120._0_4_ = (bVar66 & 1) * uVar75 | !(bool)(bVar66 & 1) * auVar120._0_4_;
          bVar71 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar120._4_4_ = bVar71 * uVar127 | !bVar71 * auVar120._4_4_;
          bVar71 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar120._8_4_ = bVar71 * uVar128 | !bVar71 * auVar120._8_4_;
          bVar71 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar120._12_4_ = bVar71 * uVar129 | !bVar71 * auVar120._12_4_;
          bVar71 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar120._16_4_ = bVar71 * uVar130 | !bVar71 * auVar120._16_4_;
          bVar71 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar120._20_4_ = bVar71 * uVar131 | !bVar71 * auVar120._20_4_;
          bVar71 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar120._24_4_ = bVar71 * uVar132 | !bVar71 * auVar120._24_4_;
          bVar71 = SUB81(uVar74 >> 7,0);
          auVar120._28_4_ = bVar71 * uVar133 | !bVar71 * auVar120._28_4_;
          auVar94 = vblendmps_avx512vl(auVar228,auVar226);
          bVar71 = (bool)((byte)(uVar13 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar13 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar13 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar13 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar13 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar13 >> 6) & 1);
          bVar11 = SUB81(uVar13 >> 7,0);
          auVar121._0_4_ =
               (uint)(bVar66 & 1) *
               ((uint)(bVar68 & 1) * auVar94._0_4_ | !(bool)(bVar68 & 1) * uVar75) |
               !(bool)(bVar66 & 1) * auVar121._0_4_;
          bVar5 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar121._4_4_ =
               (uint)bVar5 * ((uint)bVar71 * auVar94._4_4_ | !bVar71 * uVar127) |
               !bVar5 * auVar121._4_4_;
          bVar71 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar121._8_4_ =
               (uint)bVar71 * ((uint)bVar6 * auVar94._8_4_ | !bVar6 * uVar128) |
               !bVar71 * auVar121._8_4_;
          bVar71 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar121._12_4_ =
               (uint)bVar71 * ((uint)bVar7 * auVar94._12_4_ | !bVar7 * uVar129) |
               !bVar71 * auVar121._12_4_;
          bVar71 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar121._16_4_ =
               (uint)bVar71 * ((uint)bVar8 * auVar94._16_4_ | !bVar8 * uVar130) |
               !bVar71 * auVar121._16_4_;
          bVar71 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar121._20_4_ =
               (uint)bVar71 * ((uint)bVar9 * auVar94._20_4_ | !bVar9 * uVar131) |
               !bVar71 * auVar121._20_4_;
          bVar71 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar121._24_4_ =
               (uint)bVar71 * ((uint)bVar10 * auVar94._24_4_ | !bVar10 * uVar132) |
               !bVar71 * auVar121._24_4_;
          bVar71 = SUB81(uVar74 >> 7,0);
          auVar121._28_4_ =
               (uint)bVar71 * ((uint)bVar11 * auVar94._28_4_ | !bVar11 * uVar133) |
               !bVar71 * auVar121._28_4_;
          uVar73 = (ulong)(byte)((~bVar66 | bVar68) & (byte)uVar73);
        }
      }
      auVar251 = ZEXT3264(local_860);
      auVar252 = ZEXT3264(local_880);
      auVar241 = ZEXT3264(local_8a0);
      auVar242 = ZEXT3264(local_8c0);
      auVar243 = ZEXT3264(local_8e0);
      auVar245 = ZEXT3264(local_900);
      auVar247 = ZEXT3264(local_920);
      auVar250 = ZEXT3264(local_940);
      auVar93 = vmulps_avx512vl(auVar91,auVar93);
      auVar78 = vfmadd231ps_fma(auVar93,local_3c0,auVar92);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_3a0,auVar88);
      auVar225._8_4_ = 0x7fffffff;
      auVar225._0_8_ = 0x7fffffff7fffffff;
      auVar225._12_4_ = 0x7fffffff;
      auVar225._16_4_ = 0x7fffffff;
      auVar225._20_4_ = 0x7fffffff;
      auVar225._24_4_ = 0x7fffffff;
      auVar225._28_4_ = 0x7fffffff;
      auVar92 = vandps_avx(ZEXT1632(auVar78),auVar225);
      _local_1c0 = auVar89;
      auVar217._8_4_ = 0x3e99999a;
      auVar217._0_8_ = 0x3e99999a3e99999a;
      auVar217._12_4_ = 0x3e99999a;
      auVar217._16_4_ = 0x3e99999a;
      auVar217._20_4_ = 0x3e99999a;
      auVar217._24_4_ = 0x3e99999a;
      auVar217._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar92,auVar217,1);
      local_380._0_2_ = (short)uVar12;
      auVar92 = vmaxps_avx(auVar89,auVar121);
      local_320 = auVar92;
      auVar93 = vminps_avx(local_300,auVar120);
      uVar12 = vcmpps_avx512vl(auVar89,auVar93,2);
      bVar66 = (byte)uVar12 & bVar61;
      uVar14 = vcmpps_avx512vl(auVar92,local_300,2);
      auVar238 = ZEXT3264(local_7a0);
      auVar244 = ZEXT3264(local_7c0);
      auVar246 = ZEXT3264(local_7e0);
      if ((bVar61 & ((byte)uVar14 | (byte)uVar12)) == 0) {
        auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar229 = ZEXT3264(local_840);
        auVar230 = ZEXT3264(local_820);
        auVar211 = ZEXT3264(local_5e0);
      }
      else {
        uVar74 = CONCAT71((int7)(uVar73 >> 8),~(byte)uVar73);
        auVar93 = vmulps_avx512vl(auVar91,auVar98);
        auVar78 = vfmadd213ps_fma(auVar86,local_3c0,auVar93);
        auVar78 = vfmadd213ps_fma(auVar100,local_3a0,ZEXT1632(auVar78));
        auVar93 = vandps_avx(ZEXT1632(auVar78),auVar225);
        uVar12 = vcmpps_avx512vl(auVar93,auVar217,1);
        bVar68 = (byte)uVar12 | ~(byte)uVar73;
        auVar144._8_4_ = 2;
        auVar144._0_8_ = 0x200000002;
        auVar144._12_4_ = 2;
        auVar144._16_4_ = 2;
        auVar144._20_4_ = 2;
        auVar144._24_4_ = 2;
        auVar144._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar144,auVar35);
        local_2c0._0_4_ = (uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar71 = (bool)(bVar68 >> 1 & 1);
        local_2c0._4_4_ = (uint)bVar71 * auVar93._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 2 & 1);
        local_2c0._8_4_ = (uint)bVar71 * auVar93._8_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 3 & 1);
        local_2c0._12_4_ = (uint)bVar71 * auVar93._12_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 4 & 1);
        local_2c0._16_4_ = (uint)bVar71 * auVar93._16_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 5 & 1);
        local_2c0._20_4_ = (uint)bVar71 * auVar93._20_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 6 & 1);
        local_2c0._24_4_ = (uint)bVar71 * auVar93._24_4_ | (uint)!bVar71 * 2;
        local_2c0._28_4_ = (uint)(bVar68 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        local_340 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_340,local_2c0,5);
        bVar68 = (byte)uVar12 & bVar66;
        auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar230 = ZEXT3264(local_820);
        if (bVar68 == 0) {
          auVar146._4_4_ = uVar69;
          auVar146._0_4_ = uVar69;
          auVar146._8_4_ = uVar69;
          auVar146._12_4_ = uVar69;
          auVar146._16_4_ = uVar69;
          auVar146._20_4_ = uVar69;
          auVar146._24_4_ = uVar69;
          auVar146._28_4_ = uVar69;
          auVar229 = ZEXT3264(local_840);
        }
        else {
          local_2e0 = auVar92;
          local_96c = (uint)uVar74;
          auVar84 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar78 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar76 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar83 = vminps_avx(auVar84,auVar76);
          auVar84 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar76 = vmaxps_avx(auVar78,auVar84);
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar83,auVar174);
          auVar84 = vandps_avx(auVar76,auVar174);
          auVar78 = vmaxps_avx(auVar78,auVar84);
          auVar84 = vmovshdup_avx(auVar78);
          auVar84 = vmaxss_avx(auVar84,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar84);
          fVar149 = auVar78._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar76,auVar76,0xff);
          local_9e0 = auVar89._0_4_;
          fStack_9dc = auVar89._4_4_;
          fStack_9d8 = auVar89._8_4_;
          fStack_9d4 = auVar89._12_4_;
          fStack_9d0 = auVar89._16_4_;
          fStack_9cc = auVar89._20_4_;
          fStack_9c8 = auVar89._24_4_;
          fStack_9c4 = auVar89._28_4_;
          local_360 = local_9e0 + (float)local_960._0_4_;
          fStack_35c = fStack_9dc + (float)local_960._4_4_;
          fStack_358 = fStack_9d8 + fStack_958;
          fStack_354 = fStack_9d4 + fStack_954;
          fStack_350 = fStack_9d0 + fStack_950;
          fStack_34c = fStack_9cc + fStack_94c;
          fStack_348 = fStack_9c8 + fStack_948;
          fStack_344 = fStack_9c4 + fStack_944;
          do {
            auVar145._8_4_ = 0x7f800000;
            auVar145._0_8_ = 0x7f8000007f800000;
            auVar145._12_4_ = 0x7f800000;
            auVar145._16_4_ = 0x7f800000;
            auVar145._20_4_ = 0x7f800000;
            auVar145._24_4_ = 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar92 = vblendmps_avx512vl(auVar145,auVar89);
            auVar123._0_4_ =
                 (uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 1 & 1);
            auVar123._4_4_ = (uint)bVar71 * auVar92._4_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 2 & 1);
            auVar123._8_4_ = (uint)bVar71 * auVar92._8_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 3 & 1);
            auVar123._12_4_ = (uint)bVar71 * auVar92._12_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 4 & 1);
            auVar123._16_4_ = (uint)bVar71 * auVar92._16_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 5 & 1);
            auVar123._20_4_ = (uint)bVar71 * auVar92._20_4_ | (uint)!bVar71 * 0x7f800000;
            auVar123._24_4_ =
                 (uint)(bVar68 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
            auVar123._28_4_ = 0x7f800000;
            auVar92 = vshufps_avx(auVar123,auVar123,0xb1);
            auVar92 = vminps_avx(auVar123,auVar92);
            auVar93 = vshufpd_avx(auVar92,auVar92,5);
            auVar92 = vminps_avx(auVar92,auVar93);
            auVar93 = vpermpd_avx2(auVar92,0x4e);
            auVar92 = vminps_avx(auVar92,auVar93);
            uVar12 = vcmpps_avx512vl(auVar123,auVar92,0);
            bVar62 = (byte)uVar12 & bVar68;
            bVar63 = bVar68;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar16 = 0;
            for (uVar69 = (uint)bVar63; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            fVar168 = local_968;
            fVar166 = *(float *)(local_1e0 + (uint)(iVar16 << 2));
            uVar135 = 0;
            uVar231 = 0;
            uVar232 = 0;
            fVar164 = *(float *)(local_1c0 + (uint)(iVar16 << 2));
            uVar233 = 0;
            uVar234 = 0;
            uVar235 = 0;
            if ((float)local_6c0._0_4_ < 0.0) {
              local_740._0_16_ = ZEXT416((uint)*(float *)(local_1e0 + (uint)(iVar16 << 2)));
              local_760._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar16 << 2)));
              fVar168 = sqrtf((float)local_6c0._0_4_);
              fVar166 = (float)local_740._0_4_;
              uVar135 = local_740._4_4_;
              uVar231 = local_740._8_4_;
              uVar232 = local_740._12_4_;
              fVar164 = (float)local_760._0_4_;
              uVar233 = local_760._4_4_;
              uVar234 = local_760._8_4_;
              uVar235 = local_760._12_4_;
            }
            bVar71 = true;
            uVar73 = 0;
            do {
              auVar93 = local_740;
              auVar92 = local_760;
              auVar136._4_4_ = fVar164;
              auVar136._0_4_ = fVar164;
              auVar136._8_4_ = fVar164;
              auVar136._12_4_ = fVar164;
              auVar84 = vfmadd132ps_fma(auVar136,ZEXT816(0) << 0x40,local_6b0);
              fVar134 = 1.0 - fVar166;
              auVar175._0_4_ = local_5a0._0_4_ * fVar166;
              auVar175._4_4_ = local_5a0._4_4_ * fVar166;
              auVar175._8_4_ = local_5a0._8_4_ * fVar166;
              auVar175._12_4_ = local_5a0._12_4_ * fVar166;
              local_4e0._0_16_ = ZEXT416((uint)fVar134);
              auVar200._4_4_ = fVar134;
              auVar200._0_4_ = fVar134;
              auVar200._8_4_ = fVar134;
              auVar200._12_4_ = fVar134;
              auVar78 = vfmadd231ps_fma(auVar175,auVar200,local_560._0_16_);
              auVar203._0_4_ = local_580._0_4_ * fVar166;
              auVar203._4_4_ = local_580._4_4_ * fVar166;
              auVar203._8_4_ = local_580._8_4_ * fVar166;
              auVar203._12_4_ = local_580._12_4_ * fVar166;
              auVar76 = vfmadd231ps_fma(auVar203,auVar200,local_5a0._0_16_);
              auVar213._0_4_ = fVar166 * (float)local_5c0._0_4_;
              auVar213._4_4_ = fVar166 * (float)local_5c0._4_4_;
              auVar213._8_4_ = fVar166 * fStack_5b8;
              auVar213._12_4_ = fVar166 * fStack_5b4;
              auVar83 = vfmadd231ps_fma(auVar213,auVar200,local_580._0_16_);
              auVar221._0_4_ = fVar166 * auVar76._0_4_;
              auVar221._4_4_ = fVar166 * auVar76._4_4_;
              auVar221._8_4_ = fVar166 * auVar76._8_4_;
              auVar221._12_4_ = fVar166 * auVar76._12_4_;
              auVar78 = vfmadd231ps_fma(auVar221,auVar200,auVar78);
              auVar176._0_4_ = fVar166 * auVar83._0_4_;
              auVar176._4_4_ = fVar166 * auVar83._4_4_;
              auVar176._8_4_ = fVar166 * auVar83._8_4_;
              auVar176._12_4_ = fVar166 * auVar83._12_4_;
              auVar76 = vfmadd231ps_fma(auVar176,auVar200,auVar76);
              auVar204._0_4_ = fVar166 * auVar76._0_4_;
              auVar204._4_4_ = fVar166 * auVar76._4_4_;
              auVar204._8_4_ = fVar166 * auVar76._8_4_;
              auVar204._12_4_ = fVar166 * auVar76._12_4_;
              auVar83 = vfmadd231ps_fma(auVar204,auVar78,auVar200);
              auVar78 = vsubps_avx(auVar76,auVar78);
              auVar17._8_4_ = 0x40400000;
              auVar17._0_8_ = 0x4040000040400000;
              auVar17._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar78,auVar17);
              _local_4c0 = auVar83;
              auVar84 = vsubps_avx(auVar84,auVar83);
              auVar78 = vdpps_avx(auVar84,auVar84,0x7f);
              local_780._0_16_ = auVar76;
              local_680._0_16_ = auVar78;
              local_740._4_4_ = uVar135;
              local_740._0_4_ = fVar166;
              local_740._8_4_ = uVar231;
              local_740._16_16_ = auVar93._16_16_;
              local_740._12_4_ = uVar232;
              local_760._4_4_ = uVar233;
              local_760._0_4_ = fVar164;
              local_760._8_4_ = uVar234;
              local_760._16_16_ = auVar92._16_16_;
              local_760._12_4_ = uVar235;
              if (auVar78._0_4_ < 0.0) {
                auVar211._0_4_ = sqrtf(auVar78._0_4_);
                auVar211._4_60_ = extraout_var;
                auVar78 = auVar211._0_16_;
                auVar76 = local_780._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
              }
              local_500._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
              fVar134 = local_500._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar134;
              local_6e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              fVar163 = local_6e0._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(local_500._0_16_,auVar18);
              auVar83 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar83._0_4_;
              local_6a0._0_4_ = auVar78._0_4_;
              if (fVar134 < auVar79._0_4_) {
                fVar165 = sqrtf(fVar134);
                auVar78 = ZEXT416((uint)local_6a0._0_4_);
                auVar76 = local_780._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(local_500._0_16_,local_500._0_16_);
                fVar165 = auVar83._0_4_;
              }
              fVar167 = local_6e0._0_4_;
              fVar134 = fVar163 * 1.5 + fVar134 * -0.5 * fVar167 * fVar167 * fVar167;
              auVar137._0_4_ = auVar76._0_4_ * fVar134;
              auVar137._4_4_ = auVar76._4_4_ * fVar134;
              auVar137._8_4_ = auVar76._8_4_ * fVar134;
              auVar137._12_4_ = auVar76._12_4_ * fVar134;
              local_6e0._0_16_ = vdpps_avx(auVar137,auVar84,0x7f);
              auVar80 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
              auVar138._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
              auVar138._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
              auVar138._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
              auVar138._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
              auVar83 = vsubps_avx(local_680._0_16_,auVar138);
              fVar163 = auVar83._0_4_;
              auVar151._4_12_ = ZEXT812(0) << 0x20;
              auVar151._0_4_ = fVar163;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
              auVar81 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              uVar72 = fVar163 == 0.0;
              uVar70 = fVar163 < 0.0;
              if ((bool)uVar70) {
                local_600._0_4_ = auVar81._0_4_;
                local_620 = fVar134;
                fStack_61c = fVar134;
                fStack_618 = fVar134;
                fStack_614 = fVar134;
                local_610 = auVar79;
                fVar170 = sqrtf(fVar163);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar81 = ZEXT416((uint)local_600._0_4_);
                auVar78 = ZEXT416((uint)local_6a0._0_4_);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar76 = local_780._0_16_;
                auVar79 = local_610;
                fVar134 = local_620;
                fVar163 = fStack_61c;
                fVar167 = fStack_618;
                fVar148 = fStack_614;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar170 = auVar83._0_4_;
                fVar163 = fVar134;
                fVar167 = fVar134;
                fVar148 = fVar134;
              }
              auVar229 = ZEXT3264(local_840);
              auVar230 = ZEXT3264(local_820);
              auVar251 = ZEXT3264(local_860);
              auVar238 = ZEXT3264(local_7a0);
              auVar252 = ZEXT3264(local_880);
              auVar241 = ZEXT3264(local_8a0);
              auVar242 = ZEXT3264(local_8c0);
              auVar243 = ZEXT3264(local_8e0);
              auVar244 = ZEXT3264(local_7c0);
              auVar245 = ZEXT3264(local_900);
              auVar246 = ZEXT3264(local_7e0);
              auVar247 = ZEXT3264(local_920);
              auVar248 = ZEXT3264(local_800);
              auVar250 = ZEXT3264(local_940);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_740._0_16_,
                                        local_4e0._0_16_);
              fVar169 = auVar83._0_4_ * 6.0;
              fVar171 = local_740._0_4_ * 6.0;
              auVar178._0_4_ = fVar171 * (float)local_5c0._0_4_;
              auVar178._4_4_ = fVar171 * (float)local_5c0._4_4_;
              auVar178._8_4_ = fVar171 * fStack_5b8;
              auVar178._12_4_ = fVar171 * fStack_5b4;
              auVar152._4_4_ = fVar169;
              auVar152._0_4_ = fVar169;
              auVar152._8_4_ = fVar169;
              auVar152._12_4_ = fVar169;
              auVar83 = vfmadd132ps_fma(auVar152,auVar178,local_580._0_16_);
              auVar249 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_740._0_16_);
              fVar169 = auVar249._0_4_ * 6.0;
              auVar179._4_4_ = fVar169;
              auVar179._0_4_ = fVar169;
              auVar179._8_4_ = fVar169;
              auVar179._12_4_ = fVar169;
              auVar83 = vfmadd132ps_fma(auVar179,auVar83,local_5a0._0_16_);
              fVar169 = local_4e0._0_4_ * 6.0;
              auVar153._4_4_ = fVar169;
              auVar153._0_4_ = fVar169;
              auVar153._8_4_ = fVar169;
              auVar153._12_4_ = fVar169;
              auVar83 = vfmadd132ps_fma(auVar153,auVar83,local_560._0_16_);
              auVar180._0_4_ = auVar83._0_4_ * (float)local_500._0_4_;
              auVar180._4_4_ = auVar83._4_4_ * (float)local_500._0_4_;
              auVar180._8_4_ = auVar83._8_4_ * (float)local_500._0_4_;
              auVar180._12_4_ = auVar83._12_4_ * (float)local_500._0_4_;
              auVar83 = vdpps_avx(auVar76,auVar83,0x7f);
              fVar169 = auVar83._0_4_;
              auVar154._0_4_ = auVar76._0_4_ * fVar169;
              auVar154._4_4_ = auVar76._4_4_ * fVar169;
              auVar154._8_4_ = auVar76._8_4_ * fVar169;
              auVar154._12_4_ = auVar76._12_4_ * fVar169;
              auVar83 = vsubps_avx(auVar180,auVar154);
              fVar169 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar76,auVar19);
              auVar205._0_4_ = fVar134 * auVar83._0_4_ * fVar169;
              auVar205._4_4_ = fVar163 * auVar83._4_4_ * fVar169;
              auVar205._8_4_ = fVar167 * auVar83._8_4_ * fVar169;
              auVar205._12_4_ = fVar148 * auVar83._12_4_ * fVar169;
              auVar240 = ZEXT1664(auVar137);
              auVar83 = vdpps_avx(auVar82,auVar137,0x7f);
              auVar85 = vmaxss_avx(ZEXT416((uint)fVar149),
                                   ZEXT416((uint)((float)local_760._0_4_ * fVar168 * 1.9073486e-06))
                                  );
              auVar249 = vdpps_avx(auVar84,auVar205,0x7f);
              auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar149),auVar85);
              vfmadd213ss_avx512f(auVar80,ZEXT416((uint)(fVar149 / fVar165)),auVar78);
              auVar78 = vdpps_avx(local_6b0,auVar137,0x7f);
              fVar134 = auVar83._0_4_ + auVar249._0_4_;
              auVar83 = vdpps_avx(auVar84,auVar82,0x7f);
              auVar80 = vmulss_avx512f(auVar77,auVar79);
              auVar77 = vmulss_avx512f(auVar79,auVar79);
              auVar79 = vdpps_avx(auVar84,local_6b0,0x7f);
              auVar77 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar80._0_4_ * auVar77._0_4_)));
              auVar80 = vfnmadd231ss_fma(auVar83,local_6e0._0_16_,ZEXT416((uint)fVar134));
              auVar81 = vfnmadd231ss_fma(auVar79,local_6e0._0_16_,auVar78);
              auVar83 = vpermilps_avx(_local_4c0,0xff);
              fVar170 = fVar170 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar76,auVar76,0xff);
              auVar79 = vfmsub213ss_fma(auVar80,auVar77,auVar83);
              fVar163 = auVar81._0_4_ * auVar77._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar134),ZEXT416((uint)fVar163));
              fVar165 = auVar80._0_4_;
              fVar166 = local_740._0_4_ -
                        (local_6e0._0_4_ * (fVar163 / fVar165) - fVar170 * (auVar78._0_4_ / fVar165)
                        );
              uVar135 = 0;
              uVar231 = 0;
              uVar232 = 0;
              fVar164 = (float)local_760._0_4_ -
                        (fVar170 * (fVar134 / fVar165) - local_6e0._0_4_ * (auVar79._0_4_ / fVar165)
                        );
              uVar233 = 0;
              uVar234 = 0;
              uVar235 = 0;
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx512vl(local_6e0._0_16_,auVar20);
              auVar78 = vucomiss_avx512f(auVar78);
              fVar134 = (float)local_960._0_4_;
              fVar163 = (float)local_960._4_4_;
              fVar165 = fStack_958;
              fVar167 = fStack_954;
              fVar148 = fStack_950;
              fVar169 = fStack_94c;
              fVar171 = fStack_948;
              fVar198 = fStack_944;
              if (!(bool)uVar70 && !(bool)uVar72) {
                auVar78 = vaddss_avx512f(auVar85,auVar78);
                auVar78 = vfmadd231ss_fma(auVar78,local_630,ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar79 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar21);
                if (auVar79._0_4_ < auVar78._0_4_) {
                  fVar164 = fVar164 + (float)local_640._0_4_;
                  auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar164 < fVar199) {
                    bVar63 = 0;
                    goto LAB_01cde214;
                  }
                  fVar168 = *(float *)(ray + k * 4 + 0x80);
                  bVar63 = 0;
                  if (((fVar168 < fVar164) || (bVar63 = 0, fVar166 < 0.0)) || (1.0 < fVar166))
                  goto LAB_01cde214;
                  auVar181._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar181._0_4_ = local_680._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar181);
                  fVar170 = auVar78._0_4_;
                  pGVar2 = (context->scene->geometries).items[local_718].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar63 = 0;
                    goto LAB_01cde214;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar63 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01cde214;
                  fVar170 = fVar170 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar170 * fVar170 * fVar170;
                  local_9c0 = auVar84._0_4_;
                  fStack_9bc = auVar84._4_4_;
                  fStack_9b8 = auVar84._8_4_;
                  fStack_9b4 = auVar84._12_4_;
                  auVar182._0_4_ = fVar170 * local_9c0;
                  auVar182._4_4_ = fVar170 * fStack_9bc;
                  auVar182._8_4_ = fVar170 * fStack_9b8;
                  auVar182._12_4_ = fVar170 * fStack_9b4;
                  auVar83 = vfmadd213ps_fma(auVar83,auVar182,auVar76);
                  auVar78 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar84 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar183._0_4_ = auVar182._0_4_ * auVar84._0_4_;
                  auVar183._4_4_ = auVar182._4_4_ * auVar84._4_4_;
                  auVar183._8_4_ = auVar182._8_4_ * auVar84._8_4_;
                  auVar183._12_4_ = auVar182._12_4_ * auVar84._12_4_;
                  auVar76 = vfmsub231ps_fma(auVar183,auVar76,auVar78);
                  auVar78 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                  auVar139._0_4_ = auVar83._0_4_ * auVar76._0_4_;
                  auVar139._4_4_ = auVar83._4_4_ * auVar76._4_4_;
                  auVar139._8_4_ = auVar83._8_4_ * auVar76._8_4_;
                  auVar139._12_4_ = auVar83._12_4_ * auVar76._12_4_;
                  auVar78 = vfmsub231ps_fma(auVar139,auVar78,auVar84);
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar78,auVar78,0x55);
                  auStack_450 = vshufps_avx(auVar78,auVar78,0xaa);
                  local_440 = auVar78._0_4_;
                  uStack_43c = local_440;
                  uStack_438 = local_440;
                  uStack_434 = local_440;
                  local_430 = fVar166;
                  fStack_42c = fVar166;
                  fStack_428 = fVar166;
                  fStack_424 = fVar166;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_470._0_8_;
                  uStack_408 = local_470._8_8_;
                  local_400 = local_480;
                  vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar164;
                  local_980 = local_490;
                  local_710.valid = (int *)local_980;
                  local_710.geometryUserPtr = pGVar2->userPtr;
                  local_710.context = context->user;
                  local_710.hit = local_460;
                  local_710.N = 4;
                  local_780._0_4_ = fVar168;
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar240 = ZEXT1664(auVar137);
                    (*pGVar2->occlusionFilterN)(&local_710);
                    auVar250 = ZEXT3264(local_940);
                    auVar248 = ZEXT3264(local_800);
                    auVar247 = ZEXT3264(local_920);
                    auVar246 = ZEXT3264(local_7e0);
                    auVar245 = ZEXT3264(local_900);
                    auVar244 = ZEXT3264(local_7c0);
                    auVar243 = ZEXT3264(local_8e0);
                    auVar242 = ZEXT3264(local_8c0);
                    auVar241 = ZEXT3264(local_8a0);
                    auVar252 = ZEXT3264(local_880);
                    auVar238 = ZEXT3264(local_7a0);
                    auVar251 = ZEXT3264(local_860);
                    auVar230 = ZEXT3264(local_820);
                    auVar229 = ZEXT3264(local_840);
                    auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    fVar168 = (float)local_780._0_4_;
                    fVar134 = (float)local_960._0_4_;
                    fVar163 = (float)local_960._4_4_;
                    fVar165 = fStack_958;
                    fVar167 = fStack_954;
                    fVar148 = fStack_950;
                    fVar169 = fStack_94c;
                    fVar171 = fStack_948;
                    fVar198 = fStack_944;
                  }
                  uVar73 = vptestmd_avx512vl(local_980,local_980);
                  if ((uVar73 & 0xf) != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      (*p_Var4)(&local_710);
                      auVar250 = ZEXT3264(local_940);
                      auVar248 = ZEXT3264(local_800);
                      auVar247 = ZEXT3264(local_920);
                      auVar246 = ZEXT3264(local_7e0);
                      auVar245 = ZEXT3264(local_900);
                      auVar244 = ZEXT3264(local_7c0);
                      auVar243 = ZEXT3264(local_8e0);
                      auVar242 = ZEXT3264(local_8c0);
                      auVar241 = ZEXT3264(local_8a0);
                      auVar252 = ZEXT3264(local_880);
                      auVar238 = ZEXT3264(local_7a0);
                      auVar251 = ZEXT3264(local_860);
                      auVar230 = ZEXT3264(local_820);
                      auVar229 = ZEXT3264(local_840);
                      auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      fVar134 = (float)local_960._0_4_;
                      fVar163 = (float)local_960._4_4_;
                      fVar165 = fStack_958;
                      fVar167 = fStack_954;
                      fVar148 = fStack_950;
                      fVar169 = fStack_94c;
                      fVar171 = fStack_948;
                      fVar198 = fStack_944;
                      fVar168 = (float)local_780._0_4_;
                    }
                    uVar73 = vptestmd_avx512vl(local_980,local_980);
                    uVar73 = uVar73 & 0xf;
                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar5 = (bool)((byte)uVar73 & 1);
                    bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
                    bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
                    bVar8 = SUB81(uVar73 >> 3,0);
                    *(uint *)(local_710.ray + 0x80) =
                         (uint)bVar5 * auVar78._0_4_ | (uint)!bVar5 * *(int *)(local_710.ray + 0x80)
                    ;
                    *(uint *)(local_710.ray + 0x84) =
                         (uint)bVar6 * auVar78._4_4_ | (uint)!bVar6 * *(int *)(local_710.ray + 0x84)
                    ;
                    *(uint *)(local_710.ray + 0x88) =
                         (uint)bVar7 * auVar78._8_4_ | (uint)!bVar7 * *(int *)(local_710.ray + 0x88)
                    ;
                    *(uint *)(local_710.ray + 0x8c) =
                         (uint)bVar8 * auVar78._12_4_ |
                         (uint)!bVar8 * *(int *)(local_710.ray + 0x8c);
                    bVar63 = 1;
                    if ((byte)uVar73 != 0) goto LAB_01cde214;
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  bVar63 = 0;
                  goto LAB_01cde214;
                }
              }
              bVar71 = uVar73 < 4;
              uVar73 = uVar73 + 1;
            } while (uVar73 != 5);
            bVar71 = false;
            auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar63 = 5;
LAB_01cde214:
            bVar67 = (bool)(bVar67 | bVar71 & bVar63);
            uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar146._4_4_ = uVar135;
            auVar146._0_4_ = uVar135;
            auVar146._8_4_ = uVar135;
            auVar146._12_4_ = uVar135;
            auVar146._16_4_ = uVar135;
            auVar146._20_4_ = uVar135;
            auVar146._24_4_ = uVar135;
            auVar146._28_4_ = uVar135;
            auVar57._4_4_ = fStack_35c;
            auVar57._0_4_ = local_360;
            auVar57._8_4_ = fStack_358;
            auVar57._12_4_ = fStack_354;
            auVar57._16_4_ = fStack_350;
            auVar57._20_4_ = fStack_34c;
            auVar57._24_4_ = fStack_348;
            auVar57._28_4_ = fStack_344;
            uVar12 = vcmpps_avx512vl(auVar146,auVar57,0xd);
            bVar68 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar68 & (byte)uVar12;
          } while (bVar68 != 0);
          uVar74 = (ulong)local_96c;
          auVar92 = local_2e0;
        }
        auVar89 = local_320;
        bVar68 = local_380[0] | (byte)uVar74;
        auVar161._0_4_ = fVar134 + auVar92._0_4_;
        auVar161._4_4_ = fVar163 + auVar92._4_4_;
        auVar161._8_4_ = fVar165 + auVar92._8_4_;
        auVar161._12_4_ = fVar167 + auVar92._12_4_;
        auVar161._16_4_ = fVar148 + auVar92._16_4_;
        auVar161._20_4_ = fVar169 + auVar92._20_4_;
        auVar161._24_4_ = fVar171 + auVar92._24_4_;
        auVar161._28_4_ = fVar198 + auVar92._28_4_;
        uVar12 = vcmpps_avx512vl(auVar161,auVar146,2);
        bVar61 = (byte)uVar14 & bVar61 & (byte)uVar12;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar162,auVar36);
        auVar124._0_4_ = (uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar71 = (bool)(bVar68 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar71 * auVar92._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar71 * auVar92._8_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar71 * auVar92._12_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar71 * auVar92._16_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar71 * auVar92._20_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar68 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar71 * auVar92._24_4_ | (uint)!bVar71 * 2;
        auVar124._28_4_ = (uint)(bVar68 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        uVar12 = vpcmpd_avx512vl(local_340,auVar124,5);
        bVar68 = (byte)uVar12 & bVar61;
        if (bVar68 != 0) {
          local_380 = auVar124;
          auVar84 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar78 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar76 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar83 = vminps_avx(auVar84,auVar76);
          auVar84 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar76 = vmaxps_avx(auVar78,auVar84);
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar83,auVar184);
          auVar84 = vandps_avx(auVar76,auVar184);
          auVar78 = vmaxps_avx(auVar78,auVar84);
          auVar84 = vmovshdup_avx(auVar78);
          auVar84 = vmaxss_avx(auVar84,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar84);
          fVar149 = auVar78._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar76,auVar76,0xff);
          local_360 = fVar134 + local_320._0_4_;
          fStack_35c = fVar163 + local_320._4_4_;
          fStack_358 = fVar165 + local_320._8_4_;
          fStack_354 = fVar167 + local_320._12_4_;
          fStack_350 = fVar148 + local_320._16_4_;
          fStack_34c = fVar169 + local_320._20_4_;
          fStack_348 = fVar171 + local_320._24_4_;
          fStack_344 = fVar198 + local_320._28_4_;
          do {
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar92 = vblendmps_avx512vl(auVar147,auVar89);
            auVar125._0_4_ =
                 (uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar71 * auVar92._4_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar71 * auVar92._8_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 3 & 1);
            auVar125._12_4_ = (uint)bVar71 * auVar92._12_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 4 & 1);
            auVar125._16_4_ = (uint)bVar71 * auVar92._16_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar68 >> 5 & 1);
            auVar125._20_4_ = (uint)bVar71 * auVar92._20_4_ | (uint)!bVar71 * 0x7f800000;
            auVar125._24_4_ =
                 (uint)(bVar68 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
            auVar125._28_4_ = 0x7f800000;
            auVar92 = vshufps_avx(auVar125,auVar125,0xb1);
            auVar92 = vminps_avx(auVar125,auVar92);
            auVar93 = vshufpd_avx(auVar92,auVar92,5);
            auVar92 = vminps_avx(auVar92,auVar93);
            auVar93 = vpermpd_avx2(auVar92,0x4e);
            auVar92 = vminps_avx(auVar92,auVar93);
            uVar12 = vcmpps_avx512vl(auVar125,auVar92,0);
            bVar62 = (byte)uVar12 & bVar68;
            bVar63 = bVar68;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar16 = 0;
            for (uVar69 = (uint)bVar63; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            fVar168 = local_964;
            fVar166 = *(float *)(local_200 + (uint)(iVar16 << 2));
            uVar135 = 0;
            uVar231 = 0;
            uVar232 = 0;
            fVar164 = *(float *)(local_300 + (uint)(iVar16 << 2));
            uVar233 = 0;
            uVar234 = 0;
            uVar235 = 0;
            if ((float)local_6c0._0_4_ < 0.0) {
              local_740._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar16 << 2)));
              local_760._0_16_ = ZEXT416((uint)*(float *)(local_300 + (uint)(iVar16 << 2)));
              fVar168 = sqrtf((float)local_6c0._0_4_);
              fVar166 = (float)local_740._0_4_;
              uVar135 = local_740._4_4_;
              uVar231 = local_740._8_4_;
              uVar232 = local_740._12_4_;
              fVar164 = (float)local_760._0_4_;
              uVar233 = local_760._4_4_;
              uVar234 = local_760._8_4_;
              uVar235 = local_760._12_4_;
            }
            bVar71 = true;
            uVar73 = 0;
            do {
              auVar93 = local_740;
              auVar92 = local_760;
              auVar140._4_4_ = fVar164;
              auVar140._0_4_ = fVar164;
              auVar140._8_4_ = fVar164;
              auVar140._12_4_ = fVar164;
              auVar84 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_6b0);
              fVar134 = 1.0 - fVar166;
              auVar185._0_4_ = local_5a0._0_4_ * fVar166;
              auVar185._4_4_ = local_5a0._4_4_ * fVar166;
              auVar185._8_4_ = local_5a0._8_4_ * fVar166;
              auVar185._12_4_ = local_5a0._12_4_ * fVar166;
              local_4e0._0_16_ = ZEXT416((uint)fVar134);
              auVar201._4_4_ = fVar134;
              auVar201._0_4_ = fVar134;
              auVar201._8_4_ = fVar134;
              auVar201._12_4_ = fVar134;
              auVar78 = vfmadd231ps_fma(auVar185,auVar201,local_560._0_16_);
              auVar206._0_4_ = local_580._0_4_ * fVar166;
              auVar206._4_4_ = local_580._4_4_ * fVar166;
              auVar206._8_4_ = local_580._8_4_ * fVar166;
              auVar206._12_4_ = local_580._12_4_ * fVar166;
              auVar76 = vfmadd231ps_fma(auVar206,auVar201,local_5a0._0_16_);
              auVar214._0_4_ = fVar166 * (float)local_5c0._0_4_;
              auVar214._4_4_ = fVar166 * (float)local_5c0._4_4_;
              auVar214._8_4_ = fVar166 * fStack_5b8;
              auVar214._12_4_ = fVar166 * fStack_5b4;
              auVar83 = vfmadd231ps_fma(auVar214,auVar201,local_580._0_16_);
              auVar222._0_4_ = fVar166 * auVar76._0_4_;
              auVar222._4_4_ = fVar166 * auVar76._4_4_;
              auVar222._8_4_ = fVar166 * auVar76._8_4_;
              auVar222._12_4_ = fVar166 * auVar76._12_4_;
              auVar78 = vfmadd231ps_fma(auVar222,auVar201,auVar78);
              auVar186._0_4_ = fVar166 * auVar83._0_4_;
              auVar186._4_4_ = fVar166 * auVar83._4_4_;
              auVar186._8_4_ = fVar166 * auVar83._8_4_;
              auVar186._12_4_ = fVar166 * auVar83._12_4_;
              auVar76 = vfmadd231ps_fma(auVar186,auVar201,auVar76);
              auVar207._0_4_ = fVar166 * auVar76._0_4_;
              auVar207._4_4_ = fVar166 * auVar76._4_4_;
              auVar207._8_4_ = fVar166 * auVar76._8_4_;
              auVar207._12_4_ = fVar166 * auVar76._12_4_;
              auVar83 = vfmadd231ps_fma(auVar207,auVar78,auVar201);
              auVar78 = vsubps_avx(auVar76,auVar78);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar78,auVar22);
              _local_4c0 = auVar83;
              auVar78 = vsubps_avx(auVar84,auVar83);
              local_780._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              local_680._0_16_ = auVar78;
              local_740._4_4_ = uVar135;
              local_740._0_4_ = fVar166;
              local_740._8_4_ = uVar231;
              local_740._16_16_ = auVar93._16_16_;
              local_740._12_4_ = uVar232;
              local_760._4_4_ = uVar233;
              local_760._0_4_ = fVar164;
              local_760._8_4_ = uVar234;
              local_760._16_16_ = auVar92._16_16_;
              local_760._12_4_ = uVar235;
              if (auVar78._0_4_ < 0.0) {
                auVar218._0_4_ = sqrtf(auVar78._0_4_);
                auVar218._4_60_ = extraout_var_00;
                auVar78 = auVar218._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
              }
              local_500._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
              fVar134 = local_500._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar134;
              local_6e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              fVar163 = local_6e0._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(local_500._0_16_,auVar23);
              auVar84 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar84._0_4_;
              local_6a0._0_4_ = auVar78._0_4_;
              if (fVar134 < auVar83._0_4_) {
                auVar229._0_4_ = sqrtf(fVar134);
                auVar229._4_60_ = extraout_var_01;
                auVar78 = ZEXT416((uint)local_6a0._0_4_);
                auVar84 = auVar229._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar165 = local_6e0._0_4_;
              fVar134 = fVar163 * 1.5 + fVar134 * -0.5 * fVar165 * fVar165 * fVar165;
              auVar239._0_4_ = auVar76._0_4_ * fVar134;
              auVar239._4_4_ = auVar76._4_4_ * fVar134;
              auVar239._8_4_ = auVar76._8_4_ * fVar134;
              auVar239._12_4_ = auVar76._12_4_ * fVar134;
              local_6e0._0_16_ = vdpps_avx(local_780._0_16_,auVar239,0x7f);
              auVar80 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
              auVar141._0_4_ = local_6e0._0_4_ * local_6e0._0_4_;
              auVar141._4_4_ = local_6e0._4_4_ * local_6e0._4_4_;
              auVar141._8_4_ = local_6e0._8_4_ * local_6e0._8_4_;
              auVar141._12_4_ = local_6e0._12_4_ * local_6e0._12_4_;
              auVar83 = vsubps_avx(local_680._0_16_,auVar141);
              fVar163 = auVar83._0_4_;
              auVar155._4_12_ = ZEXT812(0) << 0x20;
              auVar155._0_4_ = fVar163;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar155);
              auVar81 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              uVar72 = fVar163 == 0.0;
              uVar70 = fVar163 < 0.0;
              if ((bool)uVar70) {
                local_620 = fVar134;
                fStack_61c = fVar134;
                fStack_618 = fVar134;
                fStack_614 = fVar134;
                local_610 = auVar239;
                local_600 = auVar79;
                fVar170 = sqrtf(fVar163);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar78 = ZEXT416((uint)local_6a0._0_4_);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar239 = local_610;
                auVar79 = local_600;
                fVar134 = local_620;
                fVar163 = fStack_61c;
                fVar165 = fStack_618;
                fVar167 = fStack_614;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar170 = auVar83._0_4_;
                fVar163 = fVar134;
                fVar165 = fVar134;
                fVar167 = fVar134;
              }
              auVar240 = ZEXT1664(auVar239);
              auVar229 = ZEXT3264(local_840);
              auVar230 = ZEXT3264(local_820);
              auVar251 = ZEXT3264(local_860);
              auVar238 = ZEXT3264(local_7a0);
              auVar252 = ZEXT3264(local_880);
              auVar241 = ZEXT3264(local_8a0);
              auVar242 = ZEXT3264(local_8c0);
              auVar243 = ZEXT3264(local_8e0);
              auVar244 = ZEXT3264(local_7c0);
              auVar245 = ZEXT3264(local_900);
              auVar246 = ZEXT3264(local_7e0);
              auVar247 = ZEXT3264(local_920);
              auVar248 = ZEXT3264(local_800);
              auVar250 = ZEXT3264(local_940);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_740._0_16_,
                                        local_4e0._0_16_);
              fVar148 = auVar83._0_4_ * 6.0;
              fVar169 = local_740._0_4_ * 6.0;
              auVar188._0_4_ = fVar169 * (float)local_5c0._0_4_;
              auVar188._4_4_ = fVar169 * (float)local_5c0._4_4_;
              auVar188._8_4_ = fVar169 * fStack_5b8;
              auVar188._12_4_ = fVar169 * fStack_5b4;
              auVar156._4_4_ = fVar148;
              auVar156._0_4_ = fVar148;
              auVar156._8_4_ = fVar148;
              auVar156._12_4_ = fVar148;
              auVar83 = vfmadd132ps_fma(auVar156,auVar188,local_580._0_16_);
              auVar249 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_740._0_16_);
              fVar148 = auVar249._0_4_ * 6.0;
              auVar189._4_4_ = fVar148;
              auVar189._0_4_ = fVar148;
              auVar189._8_4_ = fVar148;
              auVar189._12_4_ = fVar148;
              auVar83 = vfmadd132ps_fma(auVar189,auVar83,local_5a0._0_16_);
              fVar148 = local_4e0._0_4_ * 6.0;
              auVar157._4_4_ = fVar148;
              auVar157._0_4_ = fVar148;
              auVar157._8_4_ = fVar148;
              auVar157._12_4_ = fVar148;
              auVar83 = vfmadd132ps_fma(auVar157,auVar83,local_560._0_16_);
              auVar190._0_4_ = auVar83._0_4_ * (float)local_500._0_4_;
              auVar190._4_4_ = auVar83._4_4_ * (float)local_500._0_4_;
              auVar190._8_4_ = auVar83._8_4_ * (float)local_500._0_4_;
              auVar190._12_4_ = auVar83._12_4_ * (float)local_500._0_4_;
              auVar83 = vdpps_avx(auVar76,auVar83,0x7f);
              fVar148 = auVar83._0_4_;
              auVar158._0_4_ = auVar76._0_4_ * fVar148;
              auVar158._4_4_ = auVar76._4_4_ * fVar148;
              auVar158._8_4_ = auVar76._8_4_ * fVar148;
              auVar158._12_4_ = auVar76._12_4_ * fVar148;
              auVar83 = vsubps_avx(auVar190,auVar158);
              fVar148 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(auVar76,auVar24);
              auVar208._0_4_ = fVar134 * auVar83._0_4_ * fVar148;
              auVar208._4_4_ = fVar163 * auVar83._4_4_ * fVar148;
              auVar208._8_4_ = fVar165 * auVar83._8_4_ * fVar148;
              auVar208._12_4_ = fVar167 * auVar83._12_4_ * fVar148;
              auVar83 = vdpps_avx(auVar85,auVar239,0x7f);
              auVar249 = vmaxss_avx(ZEXT416((uint)fVar149),
                                    ZEXT416((uint)((float)local_760._0_4_ * fVar168 * 1.9073486e-06)
                                           ));
              auVar82 = vdivss_avx512f(ZEXT416((uint)fVar149),auVar84);
              auVar84 = vdpps_avx(local_780._0_16_,auVar208,0x7f);
              auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar149),auVar249);
              vfmadd213ss_avx512f(auVar80,auVar82,auVar78);
              auVar78 = vdpps_avx(local_6b0,auVar239,0x7f);
              fVar134 = auVar83._0_4_ + auVar84._0_4_;
              auVar84 = vdpps_avx(local_780._0_16_,auVar85,0x7f);
              auVar80 = vmulss_avx512f(auVar77,auVar79);
              auVar79 = vmulss_avx512f(auVar79,auVar79);
              auVar83 = vdpps_avx(local_780._0_16_,local_6b0,0x7f);
              auVar79 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar80._0_4_ * auVar79._0_4_)));
              auVar80 = vfnmadd231ss_avx512f(auVar84,local_6e0._0_16_,ZEXT416((uint)fVar134));
              auVar81 = vfnmadd231ss_avx512f(auVar83,local_6e0._0_16_,auVar78);
              auVar84 = vpermilps_avx(_local_4c0,0xff);
              fVar170 = fVar170 - auVar84._0_4_;
              auVar84 = vshufps_avx(auVar76,auVar76,0xff);
              auVar83 = vfmsub213ss_fma(auVar80,auVar79,auVar84);
              fVar163 = auVar81._0_4_ * auVar79._0_4_;
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar134),ZEXT416((uint)fVar163));
              fVar165 = auVar79._0_4_;
              auVar223._0_4_ = fVar163 / fVar165;
              auVar223._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar215._0_4_ = auVar83._0_4_ / fVar165;
              auVar215._4_12_ = auVar83._4_12_;
              auVar83 = vmulss_avx512f(local_6e0._0_16_,auVar223);
              auVar79 = vmulss_avx512f(local_6e0._0_16_,auVar215);
              fVar166 = local_740._0_4_ - (auVar83._0_4_ - fVar170 * (auVar78._0_4_ / fVar165));
              uVar135 = 0;
              uVar231 = 0;
              uVar232 = 0;
              fVar164 = (float)local_760._0_4_ - (fVar170 * (fVar134 / fVar165) - auVar79._0_4_);
              uVar233 = 0;
              uVar234 = 0;
              uVar235 = 0;
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx512vl(local_6e0._0_16_,auVar25);
              auVar78 = vucomiss_avx512f(auVar78);
              fVar134 = (float)local_960._0_4_;
              fVar163 = (float)local_960._4_4_;
              fVar165 = fStack_958;
              fVar167 = fStack_954;
              fVar148 = fStack_950;
              fVar169 = fStack_94c;
              fVar171 = fStack_948;
              fVar198 = fStack_944;
              if (!(bool)uVar70 && !(bool)uVar72) {
                auVar78 = vaddss_avx512f(auVar249,auVar78);
                auVar78 = vfmadd231ss_fma(auVar78,local_630,ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar26);
                if (auVar83._0_4_ < auVar78._0_4_) {
                  fVar164 = fVar164 + (float)local_640._0_4_;
                  auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar164 < fVar199) {
                    bVar63 = 0;
                    goto LAB_01cdee67;
                  }
                  fVar168 = *(float *)(ray + k * 4 + 0x80);
                  bVar63 = 0;
                  if (((fVar168 < fVar164) || (bVar63 = 0, fVar166 < 0.0)) || (1.0 < fVar166))
                  goto LAB_01cdee67;
                  auVar191._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar191._0_4_ = local_680._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar191);
                  fVar170 = auVar78._0_4_;
                  pGVar2 = (context->scene->geometries).items[local_718].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar63 = 0;
                    goto LAB_01cdee67;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar63 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01cdee67;
                  fVar170 = fVar170 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar170 * fVar170 * fVar170;
                  auVar192._0_4_ = local_780._0_4_ * fVar170;
                  auVar192._4_4_ = local_780._4_4_ * fVar170;
                  auVar192._8_4_ = local_780._8_4_ * fVar170;
                  auVar192._12_4_ = local_780._12_4_ * fVar170;
                  auVar83 = vfmadd213ps_fma(auVar84,auVar192,auVar76);
                  auVar78 = vshufps_avx(auVar192,auVar192,0xc9);
                  auVar84 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar193._0_4_ = auVar192._0_4_ * auVar84._0_4_;
                  auVar193._4_4_ = auVar192._4_4_ * auVar84._4_4_;
                  auVar193._8_4_ = auVar192._8_4_ * auVar84._8_4_;
                  auVar193._12_4_ = auVar192._12_4_ * auVar84._12_4_;
                  auVar76 = vfmsub231ps_fma(auVar193,auVar76,auVar78);
                  auVar78 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                  auVar142._0_4_ = auVar83._0_4_ * auVar76._0_4_;
                  auVar142._4_4_ = auVar83._4_4_ * auVar76._4_4_;
                  auVar142._8_4_ = auVar83._8_4_ * auVar76._8_4_;
                  auVar142._12_4_ = auVar83._12_4_ * auVar76._12_4_;
                  auVar78 = vfmsub231ps_fma(auVar142,auVar78,auVar84);
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar78,auVar78,0x55);
                  auStack_450 = vshufps_avx(auVar78,auVar78,0xaa);
                  local_440 = auVar78._0_4_;
                  uStack_43c = local_440;
                  uStack_438 = local_440;
                  uStack_434 = local_440;
                  local_430 = fVar166;
                  fStack_42c = fVar166;
                  fStack_428 = fVar166;
                  fStack_424 = fVar166;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_470._0_8_;
                  uStack_408 = local_470._8_8_;
                  local_400 = local_480;
                  vpcmpeqd_avx2(ZEXT1632(local_480),ZEXT1632(local_480));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar164;
                  local_980 = local_490;
                  local_710.valid = (int *)local_980;
                  local_710.geometryUserPtr = pGVar2->userPtr;
                  local_710.context = context->user;
                  local_710.hit = local_460;
                  local_710.N = 4;
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar240 = ZEXT1664(auVar239);
                    (*pGVar2->occlusionFilterN)(&local_710);
                    auVar250 = ZEXT3264(local_940);
                    auVar248 = ZEXT3264(local_800);
                    auVar247 = ZEXT3264(local_920);
                    auVar246 = ZEXT3264(local_7e0);
                    auVar245 = ZEXT3264(local_900);
                    auVar244 = ZEXT3264(local_7c0);
                    auVar243 = ZEXT3264(local_8e0);
                    auVar242 = ZEXT3264(local_8c0);
                    auVar241 = ZEXT3264(local_8a0);
                    auVar252 = ZEXT3264(local_880);
                    auVar238 = ZEXT3264(local_7a0);
                    auVar251 = ZEXT3264(local_860);
                    auVar230 = ZEXT3264(local_820);
                    auVar229 = ZEXT3264(local_840);
                    auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    fVar134 = (float)local_960._0_4_;
                    fVar163 = (float)local_960._4_4_;
                    fVar165 = fStack_958;
                    fVar167 = fStack_954;
                    fVar148 = fStack_950;
                    fVar169 = fStack_94c;
                    fVar171 = fStack_948;
                    fVar198 = fStack_944;
                  }
                  uVar73 = vptestmd_avx512vl(local_980,local_980);
                  if ((uVar73 & 0xf) != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      (*p_Var4)(&local_710);
                      auVar250 = ZEXT3264(local_940);
                      auVar248 = ZEXT3264(local_800);
                      auVar247 = ZEXT3264(local_920);
                      auVar246 = ZEXT3264(local_7e0);
                      auVar245 = ZEXT3264(local_900);
                      auVar244 = ZEXT3264(local_7c0);
                      auVar243 = ZEXT3264(local_8e0);
                      auVar242 = ZEXT3264(local_8c0);
                      auVar241 = ZEXT3264(local_8a0);
                      auVar252 = ZEXT3264(local_880);
                      auVar238 = ZEXT3264(local_7a0);
                      auVar251 = ZEXT3264(local_860);
                      auVar230 = ZEXT3264(local_820);
                      auVar229 = ZEXT3264(local_840);
                      auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      fVar134 = (float)local_960._0_4_;
                      fVar163 = (float)local_960._4_4_;
                      fVar165 = fStack_958;
                      fVar167 = fStack_954;
                      fVar148 = fStack_950;
                      fVar169 = fStack_94c;
                      fVar171 = fStack_948;
                      fVar198 = fStack_944;
                    }
                    uVar73 = vptestmd_avx512vl(local_980,local_980);
                    uVar73 = uVar73 & 0xf;
                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar5 = (bool)((byte)uVar73 & 1);
                    bVar6 = (bool)((byte)(uVar73 >> 1) & 1);
                    bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
                    bVar8 = SUB81(uVar73 >> 3,0);
                    *(uint *)(local_710.ray + 0x80) =
                         (uint)bVar5 * auVar78._0_4_ | (uint)!bVar5 * *(int *)(local_710.ray + 0x80)
                    ;
                    *(uint *)(local_710.ray + 0x84) =
                         (uint)bVar6 * auVar78._4_4_ | (uint)!bVar6 * *(int *)(local_710.ray + 0x84)
                    ;
                    *(uint *)(local_710.ray + 0x88) =
                         (uint)bVar7 * auVar78._8_4_ | (uint)!bVar7 * *(int *)(local_710.ray + 0x88)
                    ;
                    *(uint *)(local_710.ray + 0x8c) =
                         (uint)bVar8 * auVar78._12_4_ |
                         (uint)!bVar8 * *(int *)(local_710.ray + 0x8c);
                    bVar63 = 1;
                    if ((byte)uVar73 != 0) goto LAB_01cdee67;
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  bVar63 = 0;
                  goto LAB_01cdee67;
                }
              }
              bVar71 = uVar73 < 4;
              uVar73 = uVar73 + 1;
            } while (uVar73 != 5);
            bVar71 = false;
            auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar63 = 5;
LAB_01cdee67:
            bVar67 = (bool)(bVar67 | bVar71 & bVar63);
            uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar146._4_4_ = uVar135;
            auVar146._0_4_ = uVar135;
            auVar146._8_4_ = uVar135;
            auVar146._12_4_ = uVar135;
            auVar146._16_4_ = uVar135;
            auVar146._20_4_ = uVar135;
            auVar146._24_4_ = uVar135;
            auVar146._28_4_ = uVar135;
            auVar58._4_4_ = fStack_35c;
            auVar58._0_4_ = local_360;
            auVar58._8_4_ = fStack_358;
            auVar58._12_4_ = fStack_354;
            auVar58._16_4_ = fStack_350;
            auVar58._20_4_ = fStack_34c;
            auVar58._24_4_ = fStack_348;
            auVar58._28_4_ = fStack_344;
            uVar12 = vcmpps_avx512vl(auVar146,auVar58,0xd);
            bVar68 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar68 & (byte)uVar12;
            auVar124 = local_380;
          } while (bVar68 != 0);
        }
        auVar211 = ZEXT3264(local_5e0);
        uVar14 = vpcmpgtd_avx512vl(auVar124,local_340);
        uVar15 = vpcmpd_avx512vl(local_340,local_2c0,1);
        auVar196._0_4_ = fVar134 + (float)local_1c0._0_4_;
        auVar196._4_4_ = fVar163 + (float)local_1c0._4_4_;
        auVar196._8_4_ = fVar165 + fStack_1b8;
        auVar196._12_4_ = fVar167 + fStack_1b4;
        auVar196._16_4_ = fVar148 + fStack_1b0;
        auVar196._20_4_ = fVar169 + fStack_1ac;
        auVar196._24_4_ = fVar171 + fStack_1a8;
        auVar196._28_4_ = fVar198 + fStack_1a4;
        uVar12 = vcmpps_avx512vl(auVar196,auVar146,2);
        bVar66 = bVar66 & (byte)uVar15 & (byte)uVar12;
        auVar197._0_4_ = fVar134 + local_320._0_4_;
        auVar197._4_4_ = fVar163 + local_320._4_4_;
        auVar197._8_4_ = fVar165 + local_320._8_4_;
        auVar197._12_4_ = fVar167 + local_320._12_4_;
        auVar197._16_4_ = fVar148 + local_320._16_4_;
        auVar197._20_4_ = fVar169 + local_320._20_4_;
        auVar197._24_4_ = fVar171 + local_320._24_4_;
        auVar197._28_4_ = fVar198 + local_320._28_4_;
        uVar12 = vcmpps_avx512vl(auVar197,auVar146,2);
        bVar61 = bVar61 & (byte)uVar14 & (byte)uVar12 | bVar66;
        prim = local_5f0;
        if (bVar61 != 0) {
          abStack_180[uVar64 * 0x60] = bVar61;
          auVar126._0_4_ =
               (uint)(bVar66 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar66 & 1) * (int)local_320._0_4_;
          bVar71 = (bool)(bVar66 >> 1 & 1);
          auVar126._4_4_ = (uint)bVar71 * local_1c0._4_4_ | (uint)!bVar71 * (int)local_320._4_4_;
          bVar71 = (bool)(bVar66 >> 2 & 1);
          auVar126._8_4_ = (uint)bVar71 * (int)fStack_1b8 | (uint)!bVar71 * (int)local_320._8_4_;
          bVar71 = (bool)(bVar66 >> 3 & 1);
          auVar126._12_4_ = (uint)bVar71 * (int)fStack_1b4 | (uint)!bVar71 * (int)local_320._12_4_;
          bVar71 = (bool)(bVar66 >> 4 & 1);
          auVar126._16_4_ = (uint)bVar71 * (int)fStack_1b0 | (uint)!bVar71 * (int)local_320._16_4_;
          bVar71 = (bool)(bVar66 >> 5 & 1);
          auVar126._20_4_ = (uint)bVar71 * (int)fStack_1ac | (uint)!bVar71 * (int)local_320._20_4_;
          auVar126._24_4_ =
               (uint)(bVar66 >> 6) * (int)fStack_1a8 |
               (uint)!(bool)(bVar66 >> 6) * (int)local_320._24_4_;
          auVar126._28_4_ = local_320._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x60) = auVar126;
          uVar73 = vmovlps_avx(local_650);
          (&uStack_140)[uVar64 * 0xc] = uVar73;
          aiStack_138[uVar64 * 0x18] = local_a18 + 1;
          uVar64 = (ulong)((int)uVar64 + 1);
        }
      }
    }
    do {
      uVar69 = (uint)uVar64;
      uVar64 = (ulong)(uVar69 - 1);
      if (uVar69 == 0) {
        if (bVar67 != false) {
          return bVar67;
        }
        uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar38._4_4_ = uVar135;
        auVar38._0_4_ = uVar135;
        auVar38._8_4_ = uVar135;
        auVar38._12_4_ = uVar135;
        auVar38._16_4_ = uVar135;
        auVar38._20_4_ = uVar135;
        auVar38._24_4_ = uVar135;
        auVar38._28_4_ = uVar135;
        uVar12 = vcmpps_avx512vl(local_2a0,auVar38,2);
        uVar69 = (uint)uVar12 & (uint)local_5e8 - 1 & (uint)local_5e8;
        local_5e8 = (ulong)uVar69;
        if (uVar69 == 0) {
          return false;
        }
        goto LAB_01cdc738;
      }
      lVar65 = uVar64 * 0x60;
      auVar89 = *(undefined1 (*) [32])(auStack_160 + lVar65);
      auVar159._0_4_ = fVar134 + auVar89._0_4_;
      auVar159._4_4_ = fVar163 + auVar89._4_4_;
      auVar159._8_4_ = fVar165 + auVar89._8_4_;
      auVar159._12_4_ = fVar167 + auVar89._12_4_;
      auVar159._16_4_ = fVar148 + auVar89._16_4_;
      auVar159._20_4_ = fVar169 + auVar89._20_4_;
      auVar159._24_4_ = fVar171 + auVar89._24_4_;
      auVar159._28_4_ = fVar198 + auVar89._28_4_;
      uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar37._4_4_ = uVar135;
      auVar37._0_4_ = uVar135;
      auVar37._8_4_ = uVar135;
      auVar37._12_4_ = uVar135;
      auVar37._16_4_ = uVar135;
      auVar37._20_4_ = uVar135;
      auVar37._24_4_ = uVar135;
      auVar37._28_4_ = uVar135;
      uVar12 = vcmpps_avx512vl(auVar159,auVar37,2);
      uVar75 = (uint)uVar12 & (uint)abStack_180[lVar65];
    } while (uVar75 == 0);
    uVar73 = (&uStack_140)[uVar64 * 0xc];
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar73;
    auVar195._8_4_ = 0x7f800000;
    auVar195._0_8_ = 0x7f8000007f800000;
    auVar195._12_4_ = 0x7f800000;
    auVar195._16_4_ = 0x7f800000;
    auVar195._20_4_ = 0x7f800000;
    auVar195._24_4_ = 0x7f800000;
    auVar195._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar195,auVar89);
    bVar61 = (byte)uVar75;
    auVar122._0_4_ =
         (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar89._0_4_;
    bVar71 = (bool)((byte)(uVar75 >> 1) & 1);
    auVar122._4_4_ = (uint)bVar71 * auVar92._4_4_ | (uint)!bVar71 * (int)auVar89._4_4_;
    bVar71 = (bool)((byte)(uVar75 >> 2) & 1);
    auVar122._8_4_ = (uint)bVar71 * auVar92._8_4_ | (uint)!bVar71 * (int)auVar89._8_4_;
    bVar71 = (bool)((byte)(uVar75 >> 3) & 1);
    auVar122._12_4_ = (uint)bVar71 * auVar92._12_4_ | (uint)!bVar71 * (int)auVar89._12_4_;
    bVar71 = (bool)((byte)(uVar75 >> 4) & 1);
    auVar122._16_4_ = (uint)bVar71 * auVar92._16_4_ | (uint)!bVar71 * (int)auVar89._16_4_;
    bVar71 = (bool)((byte)(uVar75 >> 5) & 1);
    auVar122._20_4_ = (uint)bVar71 * auVar92._20_4_ | (uint)!bVar71 * (int)auVar89._20_4_;
    bVar71 = (bool)((byte)(uVar75 >> 6) & 1);
    auVar122._24_4_ = (uint)bVar71 * auVar92._24_4_ | (uint)!bVar71 * (int)auVar89._24_4_;
    auVar122._28_4_ =
         (uVar75 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar75 >> 7,0) * (int)auVar89._28_4_;
    auVar89 = vshufps_avx(auVar122,auVar122,0xb1);
    auVar89 = vminps_avx(auVar122,auVar89);
    auVar92 = vshufpd_avx(auVar89,auVar89,5);
    auVar89 = vminps_avx(auVar89,auVar92);
    auVar92 = vpermpd_avx2(auVar89,0x4e);
    auVar89 = vminps_avx(auVar89,auVar92);
    uVar12 = vcmpps_avx512vl(auVar122,auVar89,0);
    bVar66 = (byte)uVar12 & bVar61;
    if (bVar66 != 0) {
      uVar75 = (uint)bVar66;
    }
    uVar127 = 0;
    for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
      uVar127 = uVar127 + 1;
    }
    local_a18 = aiStack_138[uVar64 * 0x18];
    bVar61 = ~('\x01' << ((byte)uVar127 & 0x1f)) & bVar61;
    abStack_180[lVar65] = bVar61;
    if (bVar61 == 0) {
      uVar69 = uVar69 - 1;
    }
    uVar135 = (undefined4)uVar73;
    auVar143._4_4_ = uVar135;
    auVar143._0_4_ = uVar135;
    auVar143._8_4_ = uVar135;
    auVar143._12_4_ = uVar135;
    auVar143._16_4_ = uVar135;
    auVar143._20_4_ = uVar135;
    auVar143._24_4_ = uVar135;
    auVar143._28_4_ = uVar135;
    auVar78 = vmovshdup_avx(auVar150);
    auVar78 = vsubps_avx(auVar78,auVar150);
    auVar160._0_4_ = auVar78._0_4_;
    auVar160._4_4_ = auVar160._0_4_;
    auVar160._8_4_ = auVar160._0_4_;
    auVar160._12_4_ = auVar160._0_4_;
    auVar160._16_4_ = auVar160._0_4_;
    auVar160._20_4_ = auVar160._0_4_;
    auVar160._24_4_ = auVar160._0_4_;
    auVar160._28_4_ = auVar160._0_4_;
    auVar78 = vfmadd132ps_fma(auVar160,auVar143,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar78);
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_460 + (ulong)uVar127 * 4);
    uVar64 = (ulong)uVar69;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }